

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3423.cpp
# Opt level: O3

void __thiscall
chrono::fea::ShellANCF_Force::Evaluate
          (ShellANCF_Force *this,ChVectorN<double,_54> *result,double x,double y,double z)

{
  double *pdVar1;
  double *pdVar2;
  plain_array<double,_36,_1,_32> *ppVar3;
  double *pdVar4;
  double *pdVar5;
  plain_array<double,_30,_1,_16> *ppVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  undefined8 uVar11;
  undefined1 auVar12 [64];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  ChVectorN<double,_5> *pCVar55;
  ChElementShellANCF_3423 *pCVar56;
  pointer pLVar57;
  element_type *peVar58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  bool bVar76;
  undefined1 auVar77 [16];
  ChVectorN<double,_54> *__dest;
  Index outer;
  double *pdVar78;
  ChMatrixNM<double,_6,_6> *pCVar79;
  Index row_1;
  double *pdVar80;
  undefined1 (*pauVar81) [32];
  bool bVar82;
  Index col;
  long lVar83;
  LhsNested actual_lhs;
  ulong uVar84;
  double *pdVar85;
  undefined1 auVar117 [32];
  long lVar86;
  uint uVar87;
  uint uVar88;
  Transpose<Eigen::Matrix<double,_1,_8,_1,_1,_8>_> *rhs;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar114 [32];
  undefined1 auVar124 [64];
  undefined1 auVar125 [64];
  undefined1 auVar115 [32];
  undefined1 auVar126 [64];
  undefined1 auVar127 [64];
  undefined1 auVar116 [32];
  undefined1 auVar128 [64];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar129 [64];
  undefined1 auVar130 [64];
  undefined1 auVar131 [64];
  undefined1 auVar132 [64];
  undefined1 auVar133 [64];
  undefined1 auVar134 [64];
  undefined1 auVar135 [64];
  undefined1 auVar136 [64];
  undefined1 auVar137 [64];
  undefined1 auVar138 [64];
  undefined1 auVar139 [64];
  undefined1 auVar140 [64];
  undefined1 auVar141 [64];
  undefined1 auVar142 [64];
  undefined1 auVar143 [64];
  undefined1 auVar144 [64];
  undefined1 auVar145 [64];
  undefined1 auVar146 [64];
  undefined1 auVar147 [64];
  undefined1 auVar148 [64];
  undefined1 auVar149 [64];
  undefined1 auVar150 [64];
  undefined1 auVar151 [64];
  undefined1 auVar152 [64];
  undefined1 auVar153 [64];
  double dVar154;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 extraout_var [56];
  double dVar160;
  double dVar161;
  undefined8 in_XMM1_Qb;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [64];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  double dVar194;
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  ShapeVector Ny;
  ShapeVector Nx;
  ChMatrixNM<double,_1,_3> tempB3;
  ChMatrixNM<double,_1,_4> S_ANS;
  ChVectorN<double,_5> HE;
  ChMatrixNM<double,_1,_3> tempB31;
  ChVectorN<double,_6> strain_EAS;
  ChMatrixNM<double,_6,_5> M;
  ChVectorN<double,_24> Fint;
  ChMatrixNM<double,_1,_3> Nz_d0;
  ChMatrixNM<double,_1,_3> Ny_d0;
  ChMatrixNM<double,_1,_3> Nx_d0;
  ChMatrixNM<double,_6,_5> G;
  ChMatrixNM<double,_5,_6> temp56;
  ChVectorN<double,_8> d0d0Nx;
  ChVectorN<double,_8> ddNy;
  ChVectorN<double,_8> ddNx;
  ChMatrixNM<double,_5,_5> KALPHA;
  ChMatrixNM<double,_6,_24> strainD;
  ChMatrixNM<double,_6,_24> strainD_til;
  ChVectorN<double,_8> d0d0Ny;
  ShapeVector Nz;
  assign_op<double,_double> local_1911;
  undefined1 local_1910 [16];
  undefined1 local_1900 [16];
  ChVectorN<double,_54> *local_18e8;
  undefined1 local_18e0 [16];
  double local_18d0;
  double local_18c8;
  undefined1 local_18c0 [16];
  undefined1 local_18b0 [16];
  undefined1 local_18a0 [16];
  undefined1 local_1890 [16];
  ShapeVector local_1880;
  ShapeVector local_1840;
  undefined1 local_17d0 [16];
  double dStack_17c0;
  double local_17b0;
  undefined8 uStack_17a8;
  double local_17a0;
  undefined8 uStack_1798;
  undefined1 local_1790 [16];
  undefined1 local_1780 [16];
  undefined1 local_1770 [16];
  undefined1 local_1760 [16];
  undefined1 local_1750 [16];
  double local_1740;
  undefined8 uStack_1738;
  double local_1728;
  double local_1720;
  double local_1718;
  double local_1710;
  double local_1708;
  double local_1700;
  double local_16f8;
  ulong local_16f0;
  double local_16e8;
  double local_16e0;
  double local_16d8;
  ulong local_16d0;
  double local_16c8;
  double local_16c0;
  undefined8 uStack_16b8;
  ulong local_16b0;
  undefined8 uStack_16a8;
  undefined1 local_16a0 [16];
  double local_1690;
  double dStack_1688;
  double local_1680;
  double dStack_1678;
  double local_1670;
  undefined1 local_1660 [16];
  undefined8 uStack_1650;
  undefined1 local_1640 [64];
  double local_15f0 [6];
  undefined1 local_15c0 [64];
  undefined1 local_1580 [16];
  assign_op<double,_double> *paStack_1570;
  DstXprType *pDStack_1568;
  undefined8 uStack_1560;
  double dStack_1558;
  undefined8 uStack_1550;
  undefined8 uStack_1548;
  undefined1 local_1540 [64];
  undefined1 local_1500 [64];
  double local_14c0 [20];
  double adStack_1420 [12];
  undefined1 local_13c0 [16];
  double dStack_13b0;
  double dStack_13a8;
  double dStack_13a0;
  double dStack_1398;
  double dStack_1390;
  double dStack_1388;
  undefined1 local_1380 [16];
  double dStack_1370;
  double dStack_1368;
  double dStack_1360;
  double dStack_1358;
  double dStack_1350;
  double dStack_1348;
  undefined1 local_1340 [16];
  double dStack_1330;
  double dStack_1328;
  double dStack_1320;
  double dStack_1318;
  double dStack_1310;
  double dStack_1308;
  ChMatrixNM<double,_1,_3> local_12f8;
  ChMatrixNM<double,_1,_3> local_12e0;
  ChMatrixNM<double,_1,_3> local_12c8;
  DstXprType local_12b0;
  undefined1 local_11c0 [16];
  double *pdStack_11b0;
  undefined8 uStack_11a8;
  double dStack_11a0;
  undefined1 auStack_1198 [24];
  undefined1 local_1180 [16];
  double dStack_1170;
  undefined1 auStack_1168 [40];
  double local_1140;
  undefined1 auStack_1138 [40];
  double dStack_1110;
  undefined8 uStack_1108;
  undefined1 local_1100 [64];
  undefined1 local_10c0 [16];
  double dStack_10b0;
  undefined1 auStack_10a8 [40];
  undefined1 local_1080 [64];
  undefined1 local_1040 [64];
  undefined1 local_1000 [64];
  undefined1 local_fc0 [64];
  undefined1 local_f80 [64];
  undefined1 local_f40 [64];
  undefined1 local_f00 [64];
  undefined1 local_ec0 [64];
  undefined1 local_e80 [64];
  undefined1 local_e40 [64];
  undefined1 local_e00 [64];
  undefined1 local_dc0 [64];
  undefined1 local_d80 [64];
  undefined1 local_d00 [64];
  Matrix<double,_8,_1,_0,_8,_1> local_cc0;
  Matrix<double,_8,_1,_0,_8,_1> local_c80;
  Matrix<double,_8,_1,_0,_8,_1> local_c40;
  undefined1 local_c00 [64];
  undefined1 local_bc0 [192];
  undefined1 local_b00 [64];
  double local_a80;
  plainobjectbase_evaluator_data<double,_5> local_a40;
  undefined1 auStack_a38 [56];
  undefined1 local_a00 [64];
  undefined1 local_9c0 [64];
  undefined1 local_980 [64];
  undefined1 local_940 [64];
  undefined1 local_900 [64];
  undefined1 local_8c0 [64];
  undefined1 local_880 [64];
  undefined1 local_840 [64];
  undefined1 local_800 [64];
  undefined1 local_7c0 [64];
  undefined1 local_780 [64];
  undefined1 local_740 [64];
  undefined1 local_700 [64];
  undefined1 local_6c0 [64];
  undefined1 local_680 [64];
  undefined1 local_640 [64];
  undefined1 local_600 [64];
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_6,_5,_1,_6,_5>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_Eigen::Matrix<double,_6,_5,_1,_6,_5>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_5,_0,_6,_5>_>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
  local_5c0;
  undefined8 uStack_5a0;
  double dStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined8 uStack_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined1 local_540 [64];
  undefined1 local_500 [32];
  undefined8 uStack_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 uStack_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined1 local_480 [64];
  undefined1 local_440 [32];
  undefined8 uStack_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined8 uStack_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined8 uStack_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined1 local_300 [64];
  undefined1 local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined1 local_180 [64];
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_5,_6,_1,_5,_6>,_Eigen::Matrix<double,_6,_5,_1,_6,_5>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_5,_5,_0,_5,_5>_>_>
  local_128;
  Matrix<double,_8,_1,_0,_8,_1> local_100;
  ShapeVector local_c0 [2];
  
  local_1750._8_8_ = local_1750._0_8_;
  local_18c0._8_8_ = local_18c0._0_8_;
  local_1900._8_8_ = in_XMM1_Qb;
  local_1900._0_8_ = y;
  local_1910._8_8_ = local_1910._0_8_;
  local_18e0._8_8_ = local_18e0._0_8_;
  auVar124 = vpermi2pd_avx512f(_DAT_009aac80,ZEXT864((ulong)(1.0 - y)),
                               ZEXT1664(CONCAT88(y + 1.0,y + 1.0)));
  dVar154 = x + 1.0;
  auVar114._8_8_ = dVar154;
  auVar114._0_8_ = dVar154;
  auVar114._16_8_ = dVar154;
  auVar114._24_8_ = dVar154;
  auVar116._8_8_ = 0x3fd0000000000000;
  auVar116._0_8_ = 0x3fd0000000000000;
  auVar116._16_8_ = 0x3fd0000000000000;
  auVar116._24_8_ = 0x3fd0000000000000;
  auVar115 = ZEXT1632(CONCAT88(z * this->m_element->m_thickness * 0.5 * 0.25,1.0 - x));
  auVar114 = vblendpd_avx(auVar115,auVar114,0xc);
  auVar115 = vpermpd_avx2(auVar115,0x60);
  auVar115 = vunpckhpd_avx(auVar116,auVar115);
  auVar167 = ZEXT3264(CONCAT824(auVar114._24_8_ * auVar115._24_8_,
                                CONCAT816(auVar114._16_8_ * auVar115._16_8_,
                                          CONCAT88(auVar114._8_8_ * auVar115._8_8_,
                                                   auVar114._0_8_ * auVar115._0_8_))));
  auVar167 = vshuff64x2_avx512f(auVar167,auVar167,0x14);
  local_d00 = vmulpd_avx512f(auVar167,auVar124);
  local_c00 = local_d00;
  local_18e0._0_8_ = x;
  local_1910._0_8_ = z;
  local_1740 = ChElementShellANCF_3423::Calc_detJ0
                         (this->m_element,x,y,z,&local_1840,&local_1880,local_c0,&local_12c8,
                          &local_12e0,&local_12f8);
  auVar93._8_8_ = 0;
  auVar93._0_8_ = local_18e0._0_8_;
  auVar91 = ZEXT816(0x3fe0000000000000);
  auVar172._8_8_ = 0;
  auVar172._0_8_ =
       local_12c8.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[0];
  auVar182._8_8_ = 0;
  auVar182._0_8_ =
       local_12e0.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[1];
  auVar89 = vfmadd213sd_fma(ZEXT816(0xbfe0000000000000),auVar93,auVar91);
  local_1710 = local_12c8.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
               m_data.array[0];
  local_1718 = local_12e0.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
               m_data.array[1];
  local_16e8 = auVar89._0_8_;
  auVar89 = vfmadd213sd_fma(auVar91,auVar93,auVar91);
  local_16f8 = auVar89._0_8_;
  auVar89 = vfmadd213sd_fma(ZEXT816(0xbfe0000000000000),local_1900,auVar91);
  auVar91 = vfmadd213sd_fma(auVar91,local_1900,auVar91);
  local_1770._8_8_ = 0;
  local_1770._0_8_ =
       local_12e0.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[0];
  local_16f0 = auVar89._0_8_;
  local_1700 = auVar91._0_8_;
  auVar98._8_8_ = 0;
  auVar98._0_8_ =
       local_12e0.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[2];
  local_14c0[1] = 0.0;
  local_14c0[2] = 0.0;
  local_14c0[3] = 0.0;
  local_14c0[4] = 0.0;
  local_14c0[5] = 0.0;
  local_14c0[7] = 0.0;
  local_14c0[0x10] = 0.0;
  local_14c0[0x11] = 0.0;
  local_14c0[0x12] = 0.0;
  adStack_1420[0] = 0.0;
  adStack_1420[1] = 0.0;
  local_14c0[8] = 0.0;
  local_14c0[9] = 0.0;
  local_14c0[10] = 0.0;
  local_14c0[0xb] = 0.0;
  local_14c0[0xe] = 0.0;
  local_14c0[0xf] = 0.0;
  adStack_1420[2] = 0.0;
  adStack_1420[3] = 0.0;
  adStack_1420[4] = 0.0;
  adStack_1420[5] = 0.0;
  adStack_1420[6] = 0.0;
  adStack_1420[7] = 0.0;
  adStack_1420[8] = 0.0;
  adStack_1420[9] = 0.0;
  local_14c0[0] = (double)local_18e0._0_8_;
  local_14c0[6] = local_1900._0_8_;
  local_14c0[0xc] = (double)local_18e0._0_8_;
  auVar94._8_8_ = 0;
  auVar94._0_8_ =
       local_12c8.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[1];
  auVar96._8_8_ = 0;
  auVar96._0_8_ =
       local_12c8.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[2];
  local_1708 = local_12e0.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
               m_data.array[2];
  local_14c0[0x13] = (double)local_1910._0_8_;
  local_18d0 = local_12c8.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
               m_data.array[1];
  local_18c8 = local_12c8.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
               m_data.array[2];
  auVar89._8_8_ = 0;
  auVar89._0_8_ =
       local_12e0.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[2] *
       local_12c8.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[0];
  local_1790 = vfmsub231sd_fma(auVar89,auVar96,local_1770);
  auVar99._8_8_ = 0;
  auVar99._0_8_ =
       local_12c8.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[1] *
       local_12c8.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[1];
  auVar89 = vfmadd231sd_fma(auVar99,auVar172,auVar172);
  auVar89 = vfmadd231sd_fma(auVar89,auVar96,auVar96);
  auVar91._8_8_ = 0;
  auVar91._0_8_ =
       local_12e0.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[0] *
       local_12c8.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[1];
  auVar91 = vfmsub231sd_fma(auVar91,auVar172,auVar182);
  auVar89 = vsqrtsd_avx(auVar89,auVar89);
  dVar160 = 1.0 / auVar89._0_8_;
  local_18e8 = (ChVectorN<double,_54> *)
               (local_12c8.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
                m_data.array[0] * dVar160);
  local_1720 = local_12c8.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
               m_data.array[2] * dVar160;
  dVar154 = local_1790._0_8_;
  auVar173._8_8_ = 0;
  auVar173._0_8_ =
       local_12e0.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[1] *
       local_12c8.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[2];
  local_1780 = vfmsub231sd_fma(auVar173,auVar94,auVar98);
  local_18e0._0_8_ =
       local_12c8.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[1] * dVar160;
  auVar92._8_8_ = 0;
  auVar92._0_8_ = dVar154 * dVar154;
  auVar89 = vfmadd231sd_fma(auVar92,local_1780,local_1780);
  auVar89 = vfmadd231sd_fma(auVar89,auVar91,auVar91);
  auVar89 = vsqrtsd_avx(auVar89,auVar89);
  dVar161 = 1.0 / auVar89._0_8_;
  bVar76 = 2.2250738585072014e-308 <= auVar89._0_8_;
  local_16c0 = (double)((ulong)bVar76 * (long)(local_1780._0_8_ * dVar161) +
                       (ulong)!bVar76 * 0x3ff0000000000000);
  dVar154 = (double)((ulong)bVar76 * (long)(dVar154 * dVar161));
  local_16a0._8_8_ = 0;
  local_16a0._0_8_ = dVar154;
  dVar161 = (double)((ulong)bVar76 * (long)(auVar91._0_8_ * dVar161));
  local_1760._8_8_ = 0;
  local_1760._0_8_ = dVar161;
  uStack_16b8 = 0;
  auVar90._8_8_ = 0;
  auVar90._0_8_ = local_1720 * local_16c0;
  auVar187._8_8_ = 0;
  auVar187._0_8_ = local_18e8;
  auVar89 = vfmsub231sd_fma(auVar90,auVar187,local_1760);
  auVar103._8_8_ = 0;
  auVar103._0_8_ =
       local_12c8.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[1] * dVar160 * dVar161;
  auVar199._8_8_ = 0;
  auVar199._0_8_ = local_1720;
  auVar91 = vfmsub231sd_fma(auVar103,local_16a0,auVar199);
  local_1900._0_8_ = auVar91._0_8_;
  local_18c0._0_8_ = auVar89._0_8_;
  local_16b0 = 0x8000000000000000;
  uStack_16a8 = 0x8000000000000000;
  local_1750._0_8_ = (double)local_18e8 * -dVar154;
  local_1910._0_8_ =
       (this->m_element->m_layers).
       super__Vector_base<chrono::fea::ChElementShellANCF_3423::Layer,_Eigen::aligned_allocator<chrono::fea::ChElementShellANCF_3423::Layer>_>
       ._M_impl.super__Vector_impl_data._M_start[this->m_kl].m_theta;
  uStack_1738 = extraout_XMM0_Qb;
  local_16e0 = local_16e8;
  local_16d8 = local_16f8;
  local_16d0 = local_16f0;
  local_16c8 = local_1700;
  local_14c0[0xd] = local_14c0[6];
  local_15c0._0_8_ = cos((double)local_1910._0_8_);
  local_17a0 = (double)local_15c0._0_8_ * (double)local_18e8;
  local_17b0 = (double)local_15c0._0_8_ * (double)local_18e0._0_8_;
  local_1640._0_8_ = sin((double)local_1910._0_8_);
  local_17a0 = (double)local_1640._0_8_ * (double)local_1900._0_8_ + local_17a0;
  uStack_1798 = 0;
  local_17b0 = (double)local_1640._0_8_ * (double)local_18c0._0_8_ + local_17b0;
  uStack_17a8 = 0;
  local_1728 = sin((double)local_1910._0_8_);
  auVar124._0_8_ = cos((double)local_1910._0_8_);
  auVar124._8_56_ = extraout_var;
  auVar104._8_8_ = 0;
  auVar104._0_8_ = local_1728;
  auVar200._8_8_ = 0;
  auVar200._0_8_ = local_1708;
  auVar203._8_8_ = 0;
  auVar203._0_8_ = local_18c8;
  auVar100._8_8_ = uStack_17a8;
  auVar100._0_8_ = local_17b0;
  auVar102._8_8_ = uStack_16b8;
  auVar102._0_8_ = local_16c0;
  auVar101._8_8_ = uStack_1798;
  auVar101._0_8_ = local_17a0;
  lVar83 = 0;
  dVar194 = local_1770._0_8_;
  pdVar78 = (double *)
            ((long)&(this->m_element->m_layers).
                    super__Vector_base<chrono::fea::ChElementShellANCF_3423::Layer,_Eigen::aligned_allocator<chrono::fea::ChElementShellANCF_3423::Layer>_>
                    ._M_impl.super__Vector_impl_data._M_start[this->m_kl].m_T0.
                    super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage + 0x28);
  pdVar80 = &dStack_11a0;
  dVar154 = auVar124._0_8_ * (double)local_1900._0_8_ - local_1728 * (double)local_18e8;
  auVar221._8_8_ = 0;
  auVar221._0_8_ = local_18e0._0_8_;
  auVar89 = vmulsd_avx512f(auVar221,auVar104);
  auVar97._8_8_ = 0;
  auVar97._0_8_ =
       local_12f8.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[0];
  dVar161 = auVar124._0_8_ * (double)local_18c0._0_8_ - auVar89._0_8_;
  auVar95._8_8_ = 0;
  auVar95._0_8_ =
       local_12f8.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[2];
  auVar223._8_8_ = 0;
  auVar223._0_8_ = local_1720;
  auVar90 = vmulsd_avx512f(auVar223,auVar104);
  auVar105._8_8_ = 0;
  auVar105._0_8_ =
       local_12f8.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[1];
  auVar188._8_8_ = 0;
  auVar188._0_8_ =
       dVar194 * local_12f8.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
                 m_data.array[2];
  auVar89 = vfmsub231sd_fma(auVar188,auVar97,auVar200);
  auVar201._8_8_ = 0;
  auVar201._0_8_ = local_18d0;
  auVar178._8_8_ = 0;
  auVar178._0_8_ =
       local_1708 *
       local_12f8.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[1];
  auVar218._8_8_ = 0;
  auVar218._0_8_ = local_1718;
  auVar91 = vfmsub231sd_avx512f(auVar178,auVar218,auVar95);
  auVar89 = vunpcklpd_avx(auVar91,auVar89);
  auVar91 = vmulsd_avx512f(auVar218,auVar97);
  auVar91 = vfmsub231sd_fma(auVar91,auVar105,local_1770);
  auVar195._8_8_ = 0;
  auVar195._0_8_ =
       local_18d0 *
       local_12f8.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[2];
  auVar98 = vfmsub231sd_fma(auVar195,auVar105,auVar203);
  auVar98 = vunpcklpd_avx(auVar91,auVar98);
  auVar196._8_8_ = 0;
  auVar196._0_8_ =
       local_18c8 *
       local_12f8.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[0];
  auVar215._8_8_ = 0;
  auVar215._0_8_ = local_1710;
  auVar92 = vfmsub231sd_avx512f(auVar196,auVar215,auVar95);
  auVar91 = vmulsd_avx512f(auVar215,auVar105);
  auVar91 = vfmsub231sd_fma(auVar91,auVar201,auVar97);
  auVar99 = vunpcklpd_avx(local_1780,local_1790);
  auVar183._8_8_ = local_1740;
  auVar183._0_8_ = local_1740;
  auVar93 = vunpcklpd_avx512vl(auVar101,auVar102);
  auVar91 = vunpcklpd_avx(auVar92,auVar91);
  auVar89 = vdivpd_avx(auVar89,auVar183);
  auVar91 = vdivpd_avx(auVar91,auVar183);
  auVar94 = vdivpd_avx512vl(auVar98,auVar183);
  auVar98 = vdivpd_avx(auVar99,auVar183);
  auVar99 = vshufpd_avx(auVar89,auVar89,1);
  auVar95 = vshufpd_avx512vl(auVar94,auVar94,1);
  auVar92 = vshufpd_avx(auVar98,auVar98,1);
  auVar174._8_8_ = 0;
  auVar174._0_8_ = dVar161;
  auVar96 = vmulsd_avx512f(auVar174,auVar99);
  dVar160 = auVar91._0_8_;
  auVar97 = vmulsd_avx512f(auVar92,auVar174);
  auVar106._8_8_ = 0;
  auVar106._0_8_ = dVar154;
  auVar189._8_8_ = 0;
  auVar189._0_8_ = dVar161 * dVar160;
  auVar99 = vfmadd231sd_fma(auVar189,auVar106,auVar95);
  auVar100 = vunpcklpd_avx(auVar100,local_16a0);
  auVar95 = vfmadd231sd_avx512f(auVar96,auVar106,auVar89);
  auVar107._8_8_ = 0;
  auVar107._0_8_ = dVar154;
  auVar96 = vfmadd231sd_avx512f(auVar97,auVar98,auVar107);
  auVar108._8_8_ = 0;
  auVar108._0_8_ = auVar92._0_8_ * local_16a0._0_8_;
  local_1770 = vfmadd231sd_avx512f(auVar108,auVar98,auVar102);
  local_18c8 = auVar99._0_8_;
  auVar99 = vshufpd_avx(auVar89,auVar89,3);
  auVar179._0_8_ = auVar89._0_8_;
  auVar179._8_8_ = auVar179._0_8_;
  auVar190._0_8_ = auVar99._0_8_ * auVar100._0_8_;
  auVar190._8_8_ = auVar99._8_8_ * auVar100._8_8_;
  dStack_10b0 = pdVar78[-8];
  pdStack_11b0 = pdVar80;
  local_1780 = vfmadd213pd_fma(auVar179,auVar93,auVar190);
  auVar191._8_8_ = 0;
  auVar191._0_8_ = auVar92._0_8_ * local_17b0;
  auVar89 = vfmadd231sd_fma(auVar191,auVar98,auVar101);
  auVar180._0_8_ = auVar100._0_8_ * dVar160;
  auVar180._8_8_ = auVar100._8_8_ * dVar160;
  auVar98 = vshufpd_avx512vl(auVar94,auVar94,3);
  local_1790._0_8_ = auVar89._0_8_;
  auVar89 = vfmadd213pd_fma(auVar98,auVar93,auVar180);
  do {
    dVar154 = local_14c0[lVar83];
    dVar161 = local_14c0[lVar83 + 5];
    dVar160 = local_14c0[lVar83 + 10];
    dVar7 = local_14c0[lVar83 + 0xf];
    dVar8 = adStack_1420[lVar83];
    dVar9 = adStack_1420[lVar83 + 5];
    lVar86 = 0;
    pdVar85 = pdVar78;
    do {
      pdVar1 = pdVar85 + -4;
      pdVar2 = pdVar85 + -3;
      ppVar3 = (plain_array<double,_36,_1,_32> *)(pdVar85 + -5);
      dVar10 = *pdVar85;
      pdVar4 = pdVar85 + -1;
      pdVar5 = pdVar85 + -2;
      pdVar85 = pdVar85 + 6;
      pdVar80[lVar86] =
           dVar154 * ppVar3->array[0] + dVar161 * *pdVar1 + dVar160 * *pdVar2 +
           dVar7 * *pdVar5 + dVar8 * *pdVar4 + dVar9 * dVar10;
      lVar86 = lVar86 + 1;
    } while (lVar86 != 6);
    lVar83 = lVar83 + 1;
    pdVar80 = pdVar80 + 6;
  } while (lVar83 != 5);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = local_1750._0_8_;
  auVar98 = vfmadd213sd_avx512f(auVar221,auVar102,auVar13);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = local_15c0._0_8_;
  auVar99 = vmulsd_avx512f(auVar223,auVar14);
  auVar165._8_8_ = 0;
  auVar165._0_8_ = local_18d0 * (double)((ulong)dVar194 ^ local_16b0);
  auVar216._8_8_ = 0;
  auVar216._0_8_ = local_1710;
  auVar219._8_8_ = 0;
  auVar219._0_8_ = local_1718;
  auVar92 = vfmadd213sd_avx512f(auVar219,auVar216,auVar165);
  local_5c0.m_src = (SrcEvaluatorType *)local_11c0;
  local_5c0.m_dst = (DstEvaluatorType *)&local_a40;
  local_a40.data = (double *)&local_12b0;
  local_5c0.m_functor = (assign_op<double,_double> *)local_bc0;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = local_1640._0_8_;
  auVar100 = vmulsd_avx512f(auVar98,auVar15);
  local_1640._0_16_ = auVar94;
  auVar98 = vmulsd_avx512f(auVar124._0_16_,auVar98);
  local_18d0 = auVar98._0_8_ - auVar90._0_8_;
  auVar77._8_8_ = uStack_1738;
  auVar77._0_8_ = local_1740;
  local_1900 = vshufpd_avx(auVar91,auVar91,1);
  auVar91 = vshufpd_avx(auVar91,auVar91,3);
  local_1910._8_8_ = 0;
  local_1910._0_8_ = auVar99._0_8_ + auVar100._0_8_;
  local_18c0 = vunpcklpd_avx(local_1910,local_1760);
  auVar184._8_8_ = 0;
  auVar184._0_8_ = local_18d0;
  local_1750 = vfmadd231sd_avx512f(auVar95,auVar184,auVar94);
  local_18e0 = vdivsd_avx512f(auVar92,auVar77);
  dStack_10b0 = dStack_10b0 / local_1740;
  auVar89 = vfmadd213pd_fma(auVar91,local_18c0,auVar89);
  local_15c0 = ZEXT1664(auVar89);
  local_1760 = vfmadd231sd_avx512f(auVar96,auVar184,local_18e0);
  local_12b0.super_PlainObjectBase<Eigen::Matrix<double,_6,_5,_1,_6,_5>_>.m_storage.m_data.array[0]
       = dStack_10b0 * dStack_11a0;
  local_12b0.super_PlainObjectBase<Eigen::Matrix<double,_6,_5,_1,_6,_5>_>.m_storage.m_data.array[1]
       = dStack_10b0 * dStack_1170;
  local_12b0.super_PlainObjectBase<Eigen::Matrix<double,_6,_5,_1,_6,_5>_>.m_storage.m_data.array[2]
       = dStack_10b0 * local_1140;
  local_12b0.super_PlainObjectBase<Eigen::Matrix<double,_6,_5,_1,_6,_5>_>.m_storage.m_data.array[3]
       = dStack_10b0 * dStack_1110;
  local_18e8 = result;
  local_5c0.m_dstExpr = (DstXprType *)local_a40.data;
  Eigen::internal::
  copy_using_evaluator_DefaultTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_6,_5,_1,_6,_5>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_Eigen::Matrix<double,_6,_5,_1,_6,_5>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_5,_0,_6,_5>_>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_30>
  ::run(&local_5c0);
  pCVar55 = this->m_alpha_eas;
  lVar83 = 0;
  dVar161 = (pCVar55->super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>).m_storage.m_data
            .array[0];
  dVar160 = (pCVar55->super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>).m_storage.m_data
            .array[1];
  dVar194 = (pCVar55->super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>).m_storage.m_data
            .array[2];
  dVar7 = (pCVar55->super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>).m_storage.m_data.
          array[3];
  dVar154 = (pCVar55->super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>).m_storage.m_data
            .array[4];
  pdVar78 = local_12b0.super_PlainObjectBase<Eigen::Matrix<double,_6,_5,_1,_6,_5>_>.m_storage.m_data
            .array + 4;
  do {
    ppVar6 = (plain_array<double,_30,_1,_16> *)(pdVar78 + -4);
    pdVar85 = pdVar78 + -3;
    pdVar80 = pdVar78 + -2;
    pdVar1 = pdVar78 + -1;
    dVar8 = *pdVar78;
    pdVar78 = pdVar78 + 5;
    local_15f0[lVar83] =
         dVar154 * dVar8 +
         dVar161 * ppVar6->array[0] + dVar194 * *pdVar80 + dVar160 * *pdVar85 + dVar7 * *pdVar1;
    lVar83 = lVar83 + 1;
  } while (lVar83 != 6);
  auVar155._8_8_ = local_1640._0_8_;
  auVar155._0_8_ = local_1640._0_8_;
  auVar89 = vfmadd132pd_fma(auVar155,local_1780,local_18c0);
  local_1640 = ZEXT1664(auVar89);
  auVar162._8_8_ = 0;
  auVar162._0_8_ = local_18d0;
  local_5c0.m_dst = (DstEvaluatorType *)0x3ff0000000000000;
  local_11c0._0_8_ = &local_1840;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = local_18c8;
  local_1900 = vfmadd213sd_fma(local_1900,auVar162,auVar16);
  auVar163._8_8_ = 0;
  auVar163._0_8_ = local_1790._0_8_;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = local_18e0._0_8_;
  local_1910 = vfmadd132sd_fma(local_1910,auVar163,auVar17);
  local_c40.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[0] =
       0.0;
  local_c40.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[1] =
       0.0;
  local_c40.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[2] =
       0.0;
  local_c40.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[3] =
       0.0;
  local_c40.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[4] =
       0.0;
  local_c40.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[5] =
       0.0;
  local_c40.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[6] =
       0.0;
  local_c40.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[7] =
       0.0;
  Eigen::internal::gemv_dense_selector<2,1,true>::
  run<Eigen::Matrix<double,8,8,1,8,8>,Eigen::Transpose<Eigen::Matrix<double,1,8,1,1,8>>,Eigen::Matrix<double,8,1,0,8,1>>
            (&this->m_element->m_ddT,(Transpose<Eigen::Matrix<double,_1,_8,_1,_1,_8>_> *)local_11c0,
             &local_c40,(Scalar *)&local_5c0);
  local_11c0._0_8_ = &local_1880;
  local_5c0.m_dst = (DstEvaluatorType *)0x3ff0000000000000;
  local_c80.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[0] =
       0.0;
  local_c80.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[1] =
       0.0;
  local_c80.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[2] =
       0.0;
  local_c80.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[3] =
       0.0;
  local_c80.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[4] =
       0.0;
  local_c80.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[5] =
       0.0;
  local_c80.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[6] =
       0.0;
  local_c80.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[7] =
       0.0;
  Eigen::internal::gemv_dense_selector<2,1,true>::
  run<Eigen::Matrix<double,8,8,1,8,8>,Eigen::Transpose<Eigen::Matrix<double,1,8,1,1,8>>,Eigen::Matrix<double,8,1,0,8,1>>
            (&this->m_element->m_ddT,(Transpose<Eigen::Matrix<double,_1,_8,_1,_1,_8>_> *)local_11c0,
             &local_c80,(Scalar *)&local_5c0);
  local_11c0._0_8_ = &local_1840;
  local_cc0.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[0] =
       0.0;
  local_cc0.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[1] =
       0.0;
  local_cc0.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[2] =
       0.0;
  local_cc0.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[3] =
       0.0;
  local_cc0.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[4] =
       0.0;
  local_cc0.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[5] =
       0.0;
  local_cc0.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[6] =
       0.0;
  local_cc0.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[7] =
       0.0;
  local_5c0.m_dst = (DstEvaluatorType *)0x3ff0000000000000;
  Eigen::internal::gemv_dense_selector<2,1,true>::
  run<Eigen::Matrix<double,8,8,1,8,8>,Eigen::Transpose<Eigen::Matrix<double,1,8,1,1,8>>,Eigen::Matrix<double,8,1,0,8,1>>
            (&this->m_element->m_d0d0T,
             (Transpose<Eigen::Matrix<double,_1,_8,_1,_1,_8>_> *)local_11c0,&local_cc0,
             (Scalar *)&local_5c0);
  local_11c0._0_8_ = &local_1880;
  local_5c0.m_dst = (DstEvaluatorType *)0x3ff0000000000000;
  rhs = (Transpose<Eigen::Matrix<double,_1,_8,_1,_1,_8>_> *)local_11c0;
  local_100.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[0] =
       0.0;
  local_100.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[1] =
       0.0;
  local_100.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[2] =
       0.0;
  local_100.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[3] =
       0.0;
  local_100.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[4] =
       0.0;
  local_100.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[5] =
       0.0;
  local_100.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[6] =
       0.0;
  local_100.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[7] =
       0.0;
  Eigen::internal::gemv_dense_selector<2,1,true>::
  run<Eigen::Matrix<double,8,8,1,8,8>,Eigen::Transpose<Eigen::Matrix<double,1,8,1,1,8>>,Eigen::Matrix<double,8,1,0,8,1>>
            (&this->m_element->m_d0d0T,rhs,&local_100,(Scalar *)&local_5c0);
  __dest = local_18e8;
  auVar128._8_8_ =
       local_1840.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[1];
  auVar128._0_8_ =
       local_1840.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[0];
  auVar128._16_8_ =
       local_1840.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[2];
  auVar128._24_8_ =
       local_1840.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[3];
  auVar128._32_8_ =
       local_1840.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[4];
  auVar128._40_8_ =
       local_1840.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[5];
  auVar128._48_8_ =
       local_1840.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[6];
  auVar128._56_8_ =
       local_1840.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[7];
  lVar83 = 0;
  auVar126._8_8_ =
       local_c40.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array
       [1];
  auVar126._0_8_ =
       local_c40.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array
       [0];
  auVar126._16_8_ =
       local_c40.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array
       [2];
  auVar126._24_8_ =
       local_c40.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array
       [3];
  auVar126._32_8_ =
       local_c40.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array
       [4];
  auVar126._40_8_ =
       local_c40.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array
       [5];
  auVar126._48_8_ =
       local_c40.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array
       [6];
  auVar126._56_8_ =
       local_c40.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array
       [7];
  auVar124 = vmulpd_avx512f(auVar128,auVar126);
  pauVar81 = (undefined1 (*) [32])local_1580;
  auVar172 = local_1640._0_16_;
  auVar99 = vshufpd_avx512vl(auVar172,auVar172,1);
  auVar92 = vunpcklpd_avx512vl(local_1910,local_1760);
  auVar173 = local_15c0._0_16_;
  auVar89 = vmulsd_avx512f(local_1760,auVar173);
  auVar100 = vunpcklpd_avx512vl(auVar89,local_1770);
  auVar101 = vmulsd_avx512f(auVar172,local_1900);
  auVar114 = vextractf64x4_avx512f(auVar124,1);
  auVar125._8_8_ =
       local_cc0.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array
       [1];
  auVar125._0_8_ =
       local_cc0.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array
       [0];
  auVar125._16_8_ =
       local_cc0.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array
       [2];
  auVar125._24_8_ =
       local_cc0.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array
       [3];
  auVar125._32_8_ =
       local_cc0.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array
       [4];
  auVar125._40_8_ =
       local_cc0.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array
       [5];
  auVar125._48_8_ =
       local_cc0.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array
       [6];
  auVar125._56_8_ =
       local_cc0.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array
       [7];
  auVar125 = vmulpd_avx512f(auVar128,auVar125);
  auVar127._8_8_ =
       local_c80.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array
       [1];
  auVar127._0_8_ =
       local_c80.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array
       [0];
  auVar127._16_8_ =
       local_c80.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array
       [2];
  auVar127._24_8_ =
       local_c80.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array
       [3];
  auVar127._32_8_ =
       local_c80.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array
       [4];
  auVar127._40_8_ =
       local_c80.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array
       [5];
  auVar127._48_8_ =
       local_c80.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array
       [6];
  auVar127._56_8_ =
       local_c80.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array
       [7];
  pCVar56 = this->m_element;
  auVar115 = vextractf64x4_avx512f(auVar125,1);
  auVar167._8_8_ =
       local_1880.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[1];
  auVar167._0_8_ =
       local_1880.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[0];
  auVar167._16_8_ =
       local_1880.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[2];
  auVar167._24_8_ =
       local_1880.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[3];
  auVar167._32_8_ =
       local_1880.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[4];
  auVar167._40_8_ =
       local_1880.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[5];
  auVar167._48_8_ =
       local_1880.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[6];
  auVar167._56_8_ =
       local_1880.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[7];
  auVar129._8_8_ =
       local_100.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array
       [1];
  auVar129._0_8_ =
       local_100.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array
       [0];
  auVar129._16_8_ =
       local_100.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array
       [2];
  auVar129._24_8_ =
       local_100.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array
       [3];
  auVar129._32_8_ =
       local_100.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array
       [4];
  auVar129._40_8_ =
       local_100.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array
       [5];
  auVar129._48_8_ =
       local_100.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array
       [6];
  auVar129._56_8_ =
       local_100.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array
       [7];
  auVar126 = vmulpd_avx512f(auVar167,auVar127);
  auVar127 = vmulpd_avx512f(auVar128,auVar127);
  auVar116 = vextractf64x4_avx512f(auVar126,1);
  auVar167 = vmulpd_avx512f(auVar167,auVar129);
  auVar128 = vmulpd_avx512f(auVar128,auVar129);
  auVar117 = vextractf64x4_avx512f(auVar167,1);
  auVar118 = vextractf64x4_avx512f(auVar128,1);
  auVar119 = vextractf64x4_avx512f(auVar127,1);
  dVar154 = auVar128._0_8_ + auVar118._0_8_ + auVar128._8_8_ + auVar118._8_8_;
  dVar161 = auVar128._16_8_ + auVar118._16_8_ + auVar128._24_8_ + auVar118._24_8_;
  auVar156._0_8_ = dVar154 + dVar161;
  auVar156._8_8_ = dVar154 + dVar161;
  dVar154 = auVar127._0_8_ + auVar119._0_8_ + auVar127._8_8_ + auVar119._8_8_;
  dVar161 = auVar127._16_8_ + auVar119._16_8_ + auVar127._24_8_ + auVar119._24_8_;
  auVar102 = vunpcklpd_avx512vl(auVar173,local_1900);
  auVar168._0_8_ = dVar154 + dVar161;
  auVar168._8_8_ = dVar154 + dVar161;
  auVar89 = vsubpd_avx(auVar168,auVar156);
  auVar18._8_8_ = 0;
  auVar18._0_8_ =
       (pCVar56->m_strainANS).super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage
       .m_data.array[0];
  auVar157._8_8_ = 0;
  auVar157._0_8_ =
       local_d00._16_8_ *
       (pCVar56->m_strainANS).super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage
       .m_data.array[1];
  auVar91 = vfmadd132sd_fma(local_d00._0_16_,auVar157,auVar18);
  auVar98 = vextractf32x4_avx512f(local_d00,2);
  auVar90 = vmulsd_avx512f(auVar99,auVar89);
  dVar160 = auVar89._0_8_;
  auVar197._8_8_ = dVar160;
  auVar197._0_8_ = dVar160;
  auVar90 = vunpcklpd_avx512vl(auVar89,auVar90);
  auVar19._8_8_ = 0;
  auVar19._0_8_ =
       (pCVar56->m_strainANS).super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage
       .m_data.array[2];
  auVar89 = vfmadd132sd_fma(auVar98,auVar91,auVar19);
  auVar91 = vextractf32x4_avx512f(local_d00,3);
  auVar93 = vunpcklpd_avx512vl(auVar172,local_1750);
  dVar154 = auVar93._0_8_;
  auVar208._0_8_ = dVar160 * dVar154;
  dVar161 = auVar93._8_8_;
  auVar208._8_8_ = dVar160 * dVar161;
  auVar20._8_8_ = 0;
  auVar20._0_8_ =
       (pCVar56->m_strainANS).super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage
       .m_data.array[3];
  auVar89 = vfmadd132sd_fma(auVar91,auVar89,auVar20);
  auVar158._8_8_ = 0;
  auVar158._0_8_ = local_16f0;
  auVar21._8_8_ = 0;
  auVar21._0_8_ =
       (pCVar56->m_strainANS).super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage
       .m_data.array[6];
  auVar204._8_8_ = 0;
  auVar204._0_8_ =
       local_1700 *
       (pCVar56->m_strainANS).super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage
       .m_data.array[7];
  auVar91 = vfmadd231sd_fma(auVar204,auVar158,auVar21);
  auVar159._8_8_ = 0;
  auVar159._0_8_ = local_16e8;
  auVar22._8_8_ = 0;
  auVar22._0_8_ =
       (pCVar56->m_strainANS).super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage
       .m_data.array[4];
  auVar206._8_8_ = 0;
  auVar206._0_8_ =
       local_16f8 *
       (pCVar56->m_strainANS).super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage
       .m_data.array[5];
  auVar98 = vfmadd231sd_fma(auVar206,auVar159,auVar22);
  auVar94 = vfmadd213sd_avx512f(auVar173,local_1750,auVar101);
  dVar160 = auVar89._0_8_;
  auVar210._8_8_ = dVar160;
  auVar210._0_8_ = dVar160;
  auVar95 = vmulsd_avx512f(local_1760,auVar172);
  auVar96 = vmulpd_avx512vl(auVar92,auVar210);
  auVar202._8_8_ = 0;
  auVar202._0_8_ = dVar160 + dVar160;
  auVar89 = vunpcklpd_avx(auVar202,auVar210);
  auVar95 = vfmadd231sd_avx512f(auVar95,local_1750,local_1910);
  auVar97 = vmulsd_avx512f(local_1760,auVar202);
  auVar192._8_8_ = auVar91._0_8_;
  auVar192._0_8_ = auVar91._0_8_;
  auVar91 = vmulsd_avx512f(auVar99,auVar91);
  auVar99 = vmulpd_avx512vl(auVar93,auVar192);
  auVar91 = vunpcklpd_avx(auVar192,auVar91);
  dVar194 = auVar98._0_8_;
  auVar185._8_8_ = dVar194;
  auVar185._0_8_ = dVar194;
  auVar98 = vmulpd_avx512vl(auVar102,auVar185);
  auVar164._8_8_ = 0;
  auVar164._0_8_ =
       (auVar124._0_8_ + auVar114._0_8_ + auVar124._8_8_ + auVar114._8_8_ +
       auVar124._16_8_ + auVar114._16_8_ + auVar124._24_8_ + auVar114._24_8_) -
       (auVar125._0_8_ + auVar115._0_8_ + auVar125._8_8_ + auVar115._8_8_ +
       auVar125._16_8_ + auVar115._16_8_ + auVar125._24_8_ + auVar115._24_8_);
  auVar103 = vmulsd_avx512f(auVar164,ZEXT816(0x3fe0000000000000));
  auVar166._8_8_ = 0;
  auVar166._0_8_ =
       (auVar126._0_8_ + auVar116._0_8_ + auVar126._8_8_ + auVar116._8_8_ +
       auVar126._16_8_ + auVar116._16_8_ + auVar126._24_8_ + auVar116._24_8_) -
       (auVar167._0_8_ + auVar117._0_8_ + auVar167._8_8_ + auVar117._8_8_ +
       auVar167._16_8_ + auVar117._16_8_ + auVar167._24_8_ + auVar117._24_8_);
  auVar104 = vmulsd_avx512f(auVar166,ZEXT816(0x3fe0000000000000));
  auVar105 = vmovddup_avx512vl(auVar104);
  auVar106 = vmovddup_avx512vl(auVar103);
  auVar107 = vmulpd_avx512vl(auVar102,auVar105);
  auVar108 = vmulpd_avx512vl(auVar93,auVar106);
  auVar107 = vmulpd_avx512vl(auVar102,auVar107);
  auVar93 = vfmadd231pd_avx512vl(auVar107,auVar93,auVar108);
  auVar107 = vshufpd_avx512vl(auVar173,auVar173,1);
  auVar93 = vfmadd231pd_avx512vl(auVar93,auVar102,auVar208);
  auVar93 = vfmadd231pd_avx512vl(auVar93,auVar92,auVar96);
  auVar96 = vaddsd_avx512f(auVar104,auVar104);
  auVar109._0_8_ = local_1750._0_8_;
  auVar109._8_8_ = local_1640._8_8_;
  auVar99 = vfmadd231pd_avx512vl(auVar93,auVar92,auVar99);
  auVar110._0_8_ = local_1900._0_8_;
  auVar110._8_8_ = local_18c0._8_8_;
  auVar93 = vunpcklpd_avx512vl(local_1910,local_18e0);
  local_18b0 = vfmadd231pd_avx512vl(auVar99,auVar92,auVar98);
  auVar98 = vunpcklpd_avx512vl(auVar96,auVar105);
  auVar98 = vmulpd_avx512vl(auVar173,auVar98);
  auVar93 = vfmadd213pd_avx512vl(auVar93,auVar110,auVar100);
  auVar209._8_8_ = 0;
  auVar209._0_8_ = auVar103._0_8_ + auVar103._0_8_;
  auVar99 = vunpcklpd_avx512vl(auVar209,auVar106);
  auVar111._8_8_ = local_15c0._8_8_;
  auVar111._0_8_ = auVar110._0_8_;
  auVar99 = vmulpd_avx512vl(auVar172,auVar99);
  auVar100 = vmulpd_avx512vl(auVar111,auVar98);
  auVar100 = vfmadd213pd_avx512vl(auVar109,auVar99,auVar100);
  auVar101 = vfmadd213sd_avx512f(auVar173,local_1750,auVar101);
  auVar112._0_8_ = auVar95._0_8_;
  dVar160 = auVar93._8_8_;
  auVar112._8_8_ = dVar160;
  auVar100 = vfmadd213pd_avx512vl(auVar101,auVar90,auVar100);
  auVar211._0_8_ = auVar89._0_8_ * local_1910._0_8_;
  auVar211._8_8_ = auVar89._8_8_ * dVar160;
  auVar113._0_8_ = local_1760._0_8_;
  auVar113._8_8_ = dVar160;
  auVar89 = vfmadd213pd_avx512vl(auVar113,auVar211,auVar100);
  auVar91 = vfmadd213pd_avx512vl(auVar112,auVar91,auVar89);
  auVar207._8_8_ = 0;
  auVar207._0_8_ = dVar194 * auVar107._0_8_;
  auVar89 = vunpcklpd_avx(auVar185,auVar207);
  auVar100 = vmulsd_avx512f(local_1900,auVar96);
  auVar101 = vshufpd_avx512vl(auVar173,auVar173,3);
  auVar90 = vshufpd_avx512vl(auVar172,auVar172,3);
  auVar98 = vunpcklpd_avx512vl(auVar98,auVar100);
  local_18a0 = vfmadd213pd_avx512vl(auVar89,auVar93,auVar91);
  auVar205._0_8_ = auVar101._0_8_ * auVar98._0_8_;
  auVar205._8_8_ = auVar101._8_8_ * auVar98._8_8_;
  auVar89 = vmulsd_avx512f(local_1750,auVar209);
  auVar89 = vunpcklpd_avx512vl(auVar99,auVar89);
  auVar169._0_8_ = auVar101._0_8_ * dVar154;
  auVar169._8_8_ = auVar101._8_8_ * dVar161;
  auVar89 = vfmadd213pd_avx512vl(auVar89,auVar90,auVar205);
  auVar96 = vfmadd231pd_avx512vl(auVar169,auVar90,auVar102);
  auVar98 = vfmadd231pd_fma(auVar89,auVar96,auVar197);
  auVar91 = vunpcklpd_avx(auVar211,auVar97);
  auVar89 = vshufpd_avx(auVar93,auVar93,3);
  auVar171._0_8_ = auVar89._0_8_ * dVar154;
  auVar171._8_8_ = auVar89._8_8_ * dVar161;
  auVar175._0_8_ = auVar89._0_8_ * auVar102._0_8_;
  auVar175._8_8_ = auVar89._8_8_ * auVar102._8_8_;
  auVar89 = vfmadd213pd_fma(auVar91,auVar89,auVar98);
  auVar97 = vfmadd231pd_avx512vl(auVar171,auVar92,auVar90);
  auVar90 = vfmadd231pd_fma(auVar175,auVar101,auVar92);
  auVar89 = vfmadd231pd_fma(auVar89,auVar97,auVar192);
  auVar193._8_8_ =
       local_1840.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[7];
  auVar193._0_8_ =
       local_1840.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[7];
  local_1890 = vfmadd231pd_fma(auVar89,auVar90,auVar185);
  auVar89 = *(undefined1 (*) [16])
             (pCVar56->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
             m_data.array;
  auVar91 = *(undefined1 (*) [16])
             ((pCVar56->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
              m_data.array + 3);
  auVar98 = *(undefined1 (*) [16])
             ((pCVar56->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
              m_data.array + 6);
  auVar99 = *(undefined1 (*) [16])
             ((pCVar56->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
              m_data.array + 9);
  auVar92 = *(undefined1 (*) [16])
             ((pCVar56->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
              m_data.array + 0xc);
  auVar100 = *(undefined1 (*) [16])
              ((pCVar56->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage
               .m_data.array + 0xf);
  auVar101 = *(undefined1 (*) [16])
              ((pCVar56->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage
               .m_data.array + 0x12);
  auVar102 = *(undefined1 (*) [16])
              ((pCVar56->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage
               .m_data.array + 0x15);
  auVar23._8_8_ = 0;
  auVar23._0_8_ =
       local_1840.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[0];
  auVar213._8_8_ = 0;
  auVar213._0_8_ =
       (pCVar56->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
       array[2];
  auVar103 = vmulsd_avx512f(auVar213,auVar23);
  auVar24._8_8_ = 0;
  auVar24._0_8_ =
       local_1840.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[1];
  auVar214._8_8_ = 0;
  auVar214._0_8_ =
       (pCVar56->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
       array[5];
  auVar104 = vmulsd_avx512f(auVar214,auVar24);
  auVar59._8_8_ =
       local_1840.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[0];
  auVar59._0_8_ =
       local_1840.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[0];
  auVar105 = vmulpd_avx512vl(auVar89,auVar59);
  auVar60._8_8_ =
       local_1840.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[1];
  auVar60._0_8_ =
       local_1840.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[1];
  auVar105 = vfmadd231pd_avx512vl(auVar105,auVar91,auVar60);
  auVar61._8_8_ =
       local_1840.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[2];
  auVar61._0_8_ =
       local_1840.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[2];
  auVar105 = vfmadd231pd_avx512vl(auVar105,auVar98,auVar61);
  auVar103 = vaddsd_avx512f(auVar103,auVar104);
  auVar25._8_8_ = 0;
  auVar25._0_8_ =
       local_1840.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[2];
  auVar217._8_8_ = 0;
  auVar217._0_8_ =
       (pCVar56->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
       array[8];
  auVar104 = vmulsd_avx512f(auVar217,auVar25);
  auVar26._8_8_ = 0;
  auVar26._0_8_ =
       local_1840.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[3];
  auVar220._8_8_ = 0;
  auVar220._0_8_ =
       (pCVar56->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
       array[0xb];
  auVar106 = vmulsd_avx512f(auVar220,auVar26);
  auVar62._8_8_ =
       local_1840.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[3];
  auVar62._0_8_ =
       local_1840.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[3];
  auVar105 = vfmadd231pd_avx512vl(auVar105,auVar99,auVar62);
  auVar63._8_8_ =
       local_1840.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[4];
  auVar63._0_8_ =
       local_1840.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[4];
  auVar105 = vfmadd231pd_avx512vl(auVar105,auVar92,auVar63);
  auVar64._8_8_ =
       local_1840.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[5];
  auVar64._0_8_ =
       local_1840.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[5];
  auVar105 = vfmadd231pd_avx512vl(auVar105,auVar100,auVar64);
  auVar104 = vaddsd_avx512f(auVar104,auVar106);
  auVar65._8_8_ =
       local_1840.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[6];
  auVar65._0_8_ =
       local_1840.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[6];
  auVar105 = vfmadd231pd_avx512vl(auVar105,auVar101,auVar65);
  auVar103 = vaddsd_avx512f(auVar103,auVar104);
  auVar27._8_8_ = 0;
  auVar27._0_8_ =
       local_1840.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[4];
  auVar222._8_8_ = 0;
  auVar222._0_8_ =
       (pCVar56->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
       array[0xe];
  auVar104 = vmulsd_avx512f(auVar222,auVar27);
  auVar28._8_8_ = 0;
  auVar28._0_8_ =
       local_1840.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[5];
  auVar224._8_8_ = 0;
  auVar224._0_8_ =
       (pCVar56->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
       array[0x11];
  auVar106 = vmulsd_avx512f(auVar224,auVar28);
  local_1660 = vfmadd231pd_fma(auVar105,auVar193,auVar102);
  auVar104 = vaddsd_avx512f(auVar104,auVar106);
  auVar29._8_8_ = 0;
  auVar29._0_8_ =
       local_1840.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[6];
  auVar225._8_8_ = 0;
  auVar225._0_8_ =
       (pCVar56->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
       array[0x14];
  auVar105 = vmulsd_avx512f(auVar225,auVar29);
  auVar226._8_8_ = 0;
  auVar226._0_8_ =
       (pCVar56->m_d).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
       array[0x17];
  auVar106 = vmulsd_avx512f(auVar193,auVar226);
  auVar105 = vaddsd_avx512f(auVar105,auVar106);
  auVar104 = vaddsd_avx512f(auVar104,auVar105);
  auVar103 = vaddsd_avx512f(auVar103,auVar104);
  uStack_1650 = auVar103._0_8_;
  auVar115._16_8_ = uStack_1650;
  auVar115._0_16_ = local_1660;
  auVar115._24_8_ = 0;
  do {
    dVar154 = local_1840.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
              m_data.array[lVar83];
    auVar117._8_8_ = dVar154;
    auVar117._0_8_ = dVar154;
    auVar117._16_8_ = dVar154;
    auVar117._24_8_ = dVar154;
    auVar114 = vmulpd_avx512vl(auVar115,auVar117);
    lVar83 = lVar83 + 1;
    auVar118._0_24_ = auVar114._0_24_;
    auVar118._24_8_ = *(undefined8 *)(*pauVar81 + 0x18);
    *pauVar81 = auVar118;
    pauVar81 = (undefined1 (*) [32])(*pauVar81 + 0x18);
  } while (lVar83 != 8);
  auVar66._8_8_ =
       local_1880.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[0];
  auVar66._0_8_ =
       local_1880.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[0];
  auVar89 = vmulpd_avx512vl(auVar89,auVar66);
  lVar83 = 0;
  pauVar81 = (undefined1 (*) [32])local_1580;
  auVar67._8_8_ =
       local_1880.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[1];
  auVar67._0_8_ =
       local_1880.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[1];
  auVar89 = vfmadd132pd_avx512vl(auVar91,auVar89,auVar67);
  auVar30._8_8_ = 0;
  auVar30._0_8_ =
       local_1880.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[1];
  auVar91 = vmulsd_avx512f(auVar214,auVar30);
  auVar68._8_8_ =
       local_1880.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[2];
  auVar68._0_8_ =
       local_1880.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[2];
  auVar89 = vfmadd132pd_avx512vl(auVar98,auVar89,auVar68);
  auVar198._8_8_ =
       local_1880.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[7];
  auVar198._0_8_ =
       local_1880.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[7];
  auVar69._8_8_ =
       local_1880.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[3];
  auVar69._0_8_ =
       local_1880.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[3];
  auVar89 = vfmadd132pd_avx512vl(auVar99,auVar89,auVar69);
  auVar31._8_8_ = 0;
  auVar31._0_8_ =
       local_1880.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[0];
  auVar98 = vmulsd_avx512f(auVar213,auVar31);
  auVar70._8_8_ =
       local_1880.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[4];
  auVar70._0_8_ =
       local_1880.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[4];
  auVar89 = vfmadd132pd_avx512vl(auVar92,auVar89,auVar70);
  auVar32._8_8_ = 0;
  auVar32._0_8_ =
       local_1880.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[3];
  auVar99 = vmulsd_avx512f(auVar220,auVar32);
  auVar71._8_8_ =
       local_1880.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[5];
  auVar71._0_8_ =
       local_1880.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[5];
  auVar89 = vfmadd132pd_avx512vl(auVar100,auVar89,auVar71);
  auVar33._8_8_ = 0;
  auVar33._0_8_ =
       local_1880.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[6];
  auVar92 = vmulsd_avx512f(auVar225,auVar33);
  auVar34._8_8_ = 0;
  auVar34._0_8_ =
       local_1880.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[2];
  auVar100 = vmulsd_avx512f(auVar217,auVar34);
  auVar72._8_8_ =
       local_1880.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[6];
  auVar72._0_8_ =
       local_1880.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[6];
  auVar89 = vfmadd132pd_avx512vl(auVar101,auVar89,auVar72);
  auVar35._8_8_ = 0;
  auVar35._0_8_ =
       local_1880.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[5];
  auVar101 = vmulsd_avx512f(auVar224,auVar35);
  auVar119._0_16_ = vfmadd213pd_avx512vl(auVar102,auVar198,auVar89);
  auVar36._8_8_ = 0;
  auVar36._0_8_ =
       local_1880.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[4];
  auVar89 = vmulsd_avx512f(auVar222,auVar36);
  auVar102 = vmulsd_avx512f(auVar226,auVar198);
  dVar154 = dStack_1558;
  local_5c0.m_dst = (DstEvaluatorType *)local_1580._0_8_;
  local_5c0.m_src = (SrcEvaluatorType *)local_1580._8_8_;
  local_5c0.m_functor = paStack_1570;
  local_5c0.m_dstExpr = pDStack_1568;
  uStack_5a0 = uStack_1560;
  dStack_598 = dStack_1558;
  uStack_590 = uStack_1550;
  uStack_588 = uStack_1548;
  dStack_17c0 = auVar98._0_8_ + auVar91._0_8_ + auVar100._0_8_ + auVar99._0_8_ +
                auVar89._0_8_ + auVar101._0_8_ + auVar92._0_8_ + auVar102._0_8_;
  local_580 = local_1540._0_8_;
  uStack_578 = local_1540._8_8_;
  uStack_570 = local_1540._16_8_;
  uStack_568 = local_1540._24_8_;
  uStack_560 = local_1540._32_8_;
  uStack_558 = local_1540._40_8_;
  uStack_550 = local_1540._48_8_;
  uStack_548 = local_1540._56_8_;
  auVar119._16_8_ = dStack_17c0;
  auVar119._24_8_ = 0;
  local_540 = local_1500;
  do {
    dVar161 = local_1880.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
              m_data.array[lVar83];
    auVar73._8_8_ = dVar161;
    auVar73._0_8_ = dVar161;
    auVar73._16_8_ = dVar161;
    auVar73._24_8_ = dVar161;
    auVar114 = vmulpd_avx512vl(auVar119,auVar73);
    lVar83 = lVar83 + 1;
    auVar120._0_24_ = auVar114._0_24_;
    auVar120._24_8_ = *(undefined8 *)(*pauVar81 + 0x18);
    *pauVar81 = auVar120;
    pauVar81 = (undefined1 (*) [32])(*pauVar81 + 0x18);
  } while (lVar83 != 8);
  lVar83 = 0;
  pauVar81 = (undefined1 (*) [32])local_1580;
  auVar121._16_8_ = dStack_17c0;
  auVar121._0_16_ = auVar119._0_16_;
  auVar121._24_8_ = 0;
  auVar122._16_8_ = uStack_1650;
  auVar122._0_16_ = local_1660;
  auVar122._24_8_ = 0;
  local_500._0_8_ = local_1580._0_8_;
  local_500._8_8_ = local_1580._8_8_;
  local_500._16_8_ = paStack_1570;
  local_500._24_8_ = pDStack_1568;
  uStack_4e0 = uStack_1560;
  uStack_4d8 = dStack_1558;
  uStack_4d0 = uStack_1550;
  uStack_4c8 = uStack_1548;
  local_4c0 = local_1540._0_8_;
  uStack_4b8 = local_1540._8_8_;
  uStack_4b0 = local_1540._16_8_;
  uStack_4a8 = local_1540._24_8_;
  uStack_4a0 = local_1540._32_8_;
  uStack_498 = local_1540._40_8_;
  uStack_490 = local_1540._48_8_;
  uStack_488 = local_1540._56_8_;
  local_480 = local_1500;
  do {
    dVar161 = local_1880.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
              m_data.array[lVar83];
    auVar74._8_8_ = dVar161;
    auVar74._0_8_ = dVar161;
    auVar74._16_8_ = dVar161;
    auVar74._24_8_ = dVar161;
    auVar114 = vmulpd_avx512vl(auVar122,auVar74);
    dVar161 = local_1840.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
              m_data.array[lVar83];
    auVar75._8_8_ = dVar161;
    auVar75._0_8_ = dVar161;
    auVar75._16_8_ = dVar161;
    auVar75._24_8_ = dVar161;
    auVar114 = vfmadd231pd_avx512vl(auVar114,auVar121,auVar75);
    lVar83 = lVar83 + 1;
    auVar123._0_24_ = auVar114._0_24_;
    auVar123._24_8_ = *(undefined8 *)(*pauVar81 + 0x18);
    *pauVar81 = auVar123;
    pauVar81 = (undefined1 (*) [32])(*pauVar81 + 0x18);
  } while (lVar83 != 8);
  local_11c0._8_8_ = &pCVar56->m_strainANS_D;
  lVar83 = 0;
  local_440._0_8_ = local_1580._0_8_;
  local_440._8_8_ = local_1580._8_8_;
  local_440._16_8_ = paStack_1570;
  local_440._24_8_ = pDStack_1568;
  uStack_420 = uStack_1560;
  uStack_418 = dStack_1558;
  uStack_410 = uStack_1550;
  uStack_408 = uStack_1548;
  local_400 = local_1540._0_8_;
  uStack_3f8 = local_1540._8_8_;
  uStack_3f0 = local_1540._16_8_;
  uStack_3e8 = local_1540._24_8_;
  uStack_3e0 = local_1540._32_8_;
  uStack_3d8 = local_1540._40_8_;
  uStack_3d0 = local_1540._48_8_;
  uStack_3c8 = local_1540._56_8_;
  local_3c0 = local_1500._0_8_;
  uStack_3b8 = local_1500._8_8_;
  uStack_3b0 = local_1500._16_8_;
  uStack_3a8 = local_1500._24_8_;
  uStack_3a0 = local_1500._32_8_;
  uStack_398 = local_1500._40_8_;
  uStack_390 = local_1500._48_8_;
  uStack_388 = local_1500._56_8_;
  local_380 = ZEXT864(0) << 0x40;
  local_340 = ZEXT864(0) << 0x40;
  local_300 = ZEXT864(0) << 0x40;
  do {
    local_11c0._0_8_ = *(non_const_type *)(local_c00 + lVar83);
    local_17d0 = auVar119._0_16_;
    if (((ulong)pCVar56 & 0x3f) != 0) {
      __assert_fail("((internal::UIntPtr(block.data()) % (((int)1 >= (int)evaluator<XprType>::Alignment) ? (int)1 : (int)evaluator<XprType>::Alignment)) == 0) && \"data is not aligned\""
                    ,"/usr/include/eigen3/Eigen/src/Core/CoreEvaluators.h",0x4ca,
                    "Eigen::internal::block_evaluator<Eigen::Matrix<double, 8, 24, 1>, 1, 24, true>::block_evaluator(const XprType &) [ArgType = Eigen::Matrix<double, 8, 24, 1>, BlockRows = 1, BlockCols = 24, InnerPanel = true, HasDirectAccess = true]"
                   );
    }
    auVar37._8_8_ = 0;
    auVar37._0_8_ = *(non_const_type *)(local_c00 + lVar83);
    auVar124 = vbroadcastsd_avx512f(auVar37);
    lVar83 = lVar83 + 0x10;
    auVar167 = vmulpd_avx512f(auVar124,*(undefined1 (*) [64])
                                        (((ChMatrixNM<double,_8,_24> *)local_11c0._8_8_)->
                                        super_PlainObjectBase<Eigen::Matrix<double,_8,_24,_1,_8,_24>_>
                                        ).m_storage.m_data.array);
    auVar128 = vmulpd_avx512f(auVar124,*(undefined1 (*) [64])
                                        ((((ChMatrixNM<double,_8,_24> *)local_11c0._8_8_)->
                                         super_PlainObjectBase<Eigen::Matrix<double,_8,_24,_1,_8,_24>_>
                                         ).m_storage.m_data.array + 8));
    auVar124 = vmulpd_avx512f(auVar124,*(undefined1 (*) [64])
                                        ((((ChMatrixNM<double,_8,_24> *)local_11c0._8_8_)->
                                         super_PlainObjectBase<Eigen::Matrix<double,_8,_24,_1,_8,_24>_>
                                         ).m_storage.m_data.array + 0x10));
    local_11c0._8_8_ =
         (((ChMatrixNM<double,_8,_24> *)local_11c0._8_8_)->
         super_PlainObjectBase<Eigen::Matrix<double,_8,_24,_1,_8,_24>_>).m_storage.m_data.array +
         0x18;
    local_380 = vaddpd_avx512f(local_380,auVar167);
    local_340 = vaddpd_avx512f(local_340,auVar128);
    local_300 = vaddpd_avx512f(local_300,auVar124);
  } while (lVar83 != 0x40);
  local_1500 = ZEXT864(0) << 0x40;
  local_280 = ZEXT864(0) << 0x40;
  local_240 = ZEXT864(0) << 0x40;
  lVar83 = 0;
  bVar76 = true;
  do {
    bVar82 = bVar76;
    local_11c0._8_8_ =
         (pCVar56->m_strainANS_D).super_PlainObjectBase<Eigen::Matrix<double,_8,_24,_1,_8,_24>_>.
         m_storage.m_data.array + lVar83 * 0x18 + 0x90;
    local_11c0._0_8_ = (non_const_type)(&local_16d0)[lVar83];
    auVar38._8_8_ = 0;
    auVar38._0_8_ = (non_const_type)(&local_16d0)[lVar83];
    auVar124 = vbroadcastsd_avx512f(auVar38);
    auVar167 = vmulpd_avx512f(auVar124,*(undefined1 (*) [64])local_11c0._8_8_);
    auVar128 = vmulpd_avx512f(auVar124,*(undefined1 (*) [64])(local_11c0._8_8_ + 0x40));
    auVar124 = vmulpd_avx512f(auVar124,*(undefined1 (*) [64])(local_11c0._8_8_ + 0x80));
    local_1500 = vaddpd_avx512f(local_1500,auVar167);
    local_280 = vaddpd_avx512f(local_280,auVar128);
    local_240 = vaddpd_avx512f(local_240,auVar124);
    lVar83 = 1;
    bVar76 = false;
  } while (bVar82);
  local_2c0 = local_1500;
  local_1540 = local_280;
  _local_1580 = ZEXT864(0) << 0x40;
  local_1540 = ZEXT864(0) << 0x40;
  local_1500 = ZEXT864(0) << 0x40;
  lVar83 = 0;
  pdVar78 = &local_16e0;
  bVar76 = true;
  do {
    bVar82 = bVar76;
    local_11c0._8_8_ =
         (long)(pCVar56->m_strainANS_D).
               super_PlainObjectBase<Eigen::Matrix<double,_8,_24,_1,_8,_24>_>.m_storage.m_data.array
         + lVar83 + 0x300;
    local_11c0._0_8_ = (non_const_type)*pdVar78;
    auVar39._8_8_ = 0;
    auVar39._0_8_ = (non_const_type)*pdVar78;
    auVar124 = vbroadcastsd_avx512f(auVar39);
    auVar167 = vmulpd_avx512f(auVar124,*(undefined1 (*) [64])local_11c0._8_8_);
    auVar128 = vmulpd_avx512f(auVar124,*(undefined1 (*) [64])(local_11c0._8_8_ + 0x40));
    auVar124 = vmulpd_avx512f(auVar124,*(undefined1 (*) [64])(local_11c0._8_8_ + 0x80));
    lVar83 = 0xc0;
    _local_1580 = vaddpd_avx512f(_local_1580,auVar167);
    local_1540 = vaddpd_avx512f(local_1540,auVar128);
    local_1500 = vaddpd_avx512f(local_1500,auVar124);
    pdVar78 = &local_16d8;
    bVar76 = false;
  } while (bVar82);
  auVar124 = vbroadcastsd_avx512f(ZEXT816(1));
  local_200 = _local_1580;
  local_1c0 = local_1540;
  local_180 = local_1500;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = local_1910._0_8_;
  auVar167 = vbroadcastsd_avx512f(auVar40);
  auVar41._8_8_ = 0;
  auVar41._0_8_ = auVar110._0_8_;
  auVar128 = vbroadcastsd_avx512f(auVar41);
  auVar125 = vbroadcastsd_avx512f(auVar93);
  auVar127 = vbroadcastsd_avx512f(auVar96);
  auVar126 = vbroadcastsd_avx512f(auVar97);
  auVar129 = vbroadcastsd_avx512f(auVar90);
  auVar130 = vbroadcastsd_avx512f(auVar172);
  auVar131 = vbroadcastsd_avx512f(auVar173);
  auVar132 = vbroadcastsd_avx512f(local_1750);
  auVar133 = vbroadcastsd_avx512f(local_1760);
  auVar134 = vbroadcastsd_avx512f(auVar94);
  auVar135 = vbroadcastsd_avx512f(auVar95);
  lVar83 = 0;
  auVar212._8_8_ = 0;
  auVar212._0_8_ = auVar107._0_8_ * dVar154;
  auVar136 = vbroadcastsd_avx512f(auVar212);
  auVar137 = vpermpd_avx512f(auVar124,local_1640);
  auVar138 = vpermpd_avx512f(auVar124,local_15c0);
  auVar139 = vpermpd_avx512f(auVar124,ZEXT1664(auVar93));
  auVar140 = vpermpd_avx512f(auVar124,ZEXT1664(auVar96));
  auVar141 = vpermpd_avx512f(auVar124,ZEXT1664(auVar97));
  auVar124 = vpermpd_avx512f(auVar124,ZEXT1664(auVar90));
  do {
    auVar149 = *(undefined1 (*) [64])(local_500 + lVar83 * 8);
    auVar152 = *(undefined1 (*) [64])(&local_5c0.m_dst + lVar83);
    auVar12 = *(undefined1 (*) [64])(local_440 + lVar83 * 8);
    auVar153 = *(undefined1 (*) [64])(local_380 + lVar83 * 8);
    auVar142 = vmulpd_avx512f(auVar131,auVar149);
    auVar143 = vmulpd_avx512f(auVar130,auVar152);
    auVar144 = vmulpd_avx512f(auVar128,auVar149);
    auVar145 = vaddpd_avx512f(auVar153,auVar153);
    auVar142 = vmulpd_avx512f(auVar131,auVar142);
    auVar146 = vmulpd_avx512f(auVar167,auVar145);
    auVar142 = vfmadd231pd_avx512f(auVar142,auVar130,auVar143);
    auVar143 = vmulpd_avx512f(auVar130,auVar12);
    auVar142 = vfmadd213pd_avx512f(auVar143,auVar131,auVar142);
    auVar143 = vmulpd_avx512f(auVar167,auVar153);
    auVar143 = vfmadd213pd_avx512f(auVar143,auVar167,auVar142);
    auVar142 = *(undefined1 (*) [64])(local_2c0 + lVar83 * 8);
    auVar147 = vmulpd_avx512f(auVar130,auVar142);
    auVar147 = vfmadd213pd_avx512f(auVar147,auVar167,auVar143);
    auVar143 = *(undefined1 (*) [64])(local_200 + lVar83 * 8);
    auVar148 = vmulpd_avx512f(auVar131,auVar143);
    auVar147 = vfmadd213pd_avx512f(auVar148,auVar167,auVar147);
    auVar148 = vmulpd_avx512f(auVar132,auVar152);
    *(undefined1 (*) [64])(auStack_a38 + lVar83 * 8 + -8) = auVar147;
    auVar144 = vmulpd_avx512f(auVar128,auVar144);
    auVar147 = vaddpd_avx512f(auVar149,auVar149);
    auVar149 = vmulpd_avx512f(auVar138,auVar149);
    auVar144 = vfmadd231pd_avx512f(auVar144,auVar132,auVar148);
    auVar148 = vmulpd_avx512f(auVar132,auVar12);
    auVar149 = vmulpd_avx512f(auVar138,auVar149);
    auVar150 = vmulpd_avx512f(auVar131,auVar147);
    auVar151 = vmulpd_avx512f(auVar128,auVar150);
    auVar144 = vfmadd213pd_avx512f(auVar148,auVar128,auVar144);
    auVar148 = vmulpd_avx512f(auVar133,auVar153);
    auVar144 = vfmadd213pd_avx512f(auVar148,auVar133,auVar144);
    auVar148 = vmulpd_avx512f(auVar132,auVar142);
    auVar144 = vfmadd213pd_avx512f(auVar148,auVar133,auVar144);
    auVar148 = vmulpd_avx512f(auVar128,auVar143);
    auVar144 = vfmadd213pd_avx512f(auVar148,auVar133,auVar144);
    auVar148 = vaddpd_avx512f(auVar152,auVar152);
    auVar152 = vmulpd_avx512f(auVar137,auVar152);
    auVar149 = vfmadd231pd_avx512f(auVar149,auVar137,auVar152);
    auVar152 = vmulpd_avx512f(auVar137,auVar12);
    *(undefined1 (*) [64])(local_980 + lVar83 * 8) = auVar144;
    auVar144 = vmulpd_avx512f(auVar130,auVar148);
    auVar149 = vfmadd213pd_avx512f(auVar152,auVar138,auVar149);
    auVar152 = vmulpd_avx512f(auVar139,auVar153);
    auVar153 = vfmadd231pd_avx512f(auVar151,auVar144,auVar132);
    auVar148 = vmulpd_avx512f(auVar132,auVar148);
    auVar149 = vfmadd213pd_avx512f(auVar152,auVar139,auVar149);
    auVar152 = vmulpd_avx512f(auVar137,auVar142);
    auVar153 = vfmadd231pd_avx512f(auVar153,auVar12,auVar134);
    auVar149 = vfmadd213pd_avx512f(auVar152,auVar139,auVar149);
    auVar152 = vmulpd_avx512f(auVar138,auVar150);
    auVar153 = vfmadd231pd_avx512f(auVar153,auVar146,auVar133);
    auVar152 = vfmadd231pd_avx512f(auVar152,auVar137,auVar144);
    auVar153 = vfmadd231pd_avx512f(auVar153,auVar142,auVar135);
    auVar149 = vfmadd231pd_avx512f(auVar149,auVar136,auVar139);
    auVar152 = vfmadd231pd_avx512f(auVar152,auVar12,auVar127);
    auVar153 = vfmadd231pd_avx512f(auVar153,auVar143,auVar125);
    auVar152 = vfmadd231pd_avx512f(auVar152,auVar139,auVar146);
    *(undefined1 (*) [64])(local_8c0 + lVar83 * 8) = auVar153;
    *(undefined1 (*) [64])(local_800 + lVar83 * 8) = auVar149;
    auVar149 = vfmadd231pd_avx512f(auVar152,auVar142,auVar126);
    auVar149 = vfmadd231pd_avx512f(auVar149,auVar143,auVar129);
    *(undefined1 (*) [64])(local_740 + lVar83 * 8) = auVar149;
    auVar149 = vmulpd_avx512f(auVar128,auVar147);
    auVar149 = vmulpd_avx512f(auVar138,auVar149);
    auVar149 = vfmadd231pd_avx512f(auVar149,auVar137,auVar148);
    auVar149 = vfmadd231pd_avx512f(auVar149,auVar140,auVar12);
    auVar152 = vmulpd_avx512f(auVar133,auVar145);
    auVar149 = vfmadd213pd_avx512f(auVar152,auVar139,auVar149);
    auVar149 = vfmadd231pd_avx512f(auVar149,auVar141,auVar142);
    auVar149 = vfmadd231pd_avx512f(auVar149,auVar124,auVar143);
    *(undefined1 (*) [64])(local_680 + lVar83 * 8) = auVar149;
    lVar83 = lVar83 + 8;
  } while (lVar83 != 0x18);
  auVar91 = ZEXT816(0) << 0x40;
  auVar98 = ZEXT816(0) << 0x40;
  lVar83 = 0;
  auVar89 = ZEXT816(0) << 0x40;
  do {
    auVar176._8_8_ = 0;
    auVar176._0_8_ = *(ulong *)(auStack_a38 + lVar83 * 8 + -8);
    dVar154 = (pCVar56->m_d_dt).super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>.
              m_storage.m_data.array[lVar83];
    auVar186._8_8_ = dVar154;
    auVar186._0_8_ = dVar154;
    auVar181._8_8_ = 0;
    auVar181._0_8_ = *(ulong *)(local_8c0 + lVar83 * 8);
    auVar99 = vmovhpd_avx(auVar176,*(undefined8 *)(local_980 + lVar83 * 8));
    auVar89 = vfmadd231pd_fma(auVar89,auVar186,auVar99);
    auVar99 = vmovhpd_avx(auVar181,*(undefined8 *)(local_800 + lVar83 * 8));
    auVar91 = vfmadd231pd_fma(auVar91,auVar186,auVar99);
    auVar177._8_8_ = 0;
    auVar177._0_8_ = *(ulong *)(local_740 + lVar83 * 8);
    auVar99 = vmovhpd_avx(auVar177,*(undefined8 *)(local_680 + lVar83 * 8));
    lVar83 = lVar83 + 1;
    auVar98 = vfmadd231pd_fma(auVar98,auVar186,auVar99);
  } while (lVar83 != 0x18);
  dVar154 = pCVar56->m_Alpha;
  local_18b0._0_8_ = local_15f0[0] + (double)local_18b0._0_8_ + auVar89._0_8_ * dVar154;
  local_18b0._8_8_ = local_15f0[1] + (double)local_18b0._8_8_ + auVar89._8_8_ * dVar154;
  local_18a0._0_8_ = local_15f0[2] + (double)local_18a0._0_8_ + auVar91._0_8_ * dVar154;
  local_18a0._8_8_ = local_15f0[3] + (double)local_18a0._8_8_ + auVar91._8_8_ * dVar154;
  local_1890._0_8_ = local_15f0[4] + (double)local_1890._0_8_ + auVar98._0_8_ * dVar154;
  local_1890._8_8_ = local_15f0[5] + (double)local_1890._8_8_ + auVar98._8_8_ * dVar154;
  pLVar57 = (pCVar56->m_layers).
            super__Vector_base<chrono::fea::ChElementShellANCF_3423::Layer,_Eigen::aligned_allocator<chrono::fea::ChElementShellANCF_3423::Layer>_>
            ._M_impl.super__Vector_impl_data._M_start;
  peVar58 = pLVar57[this->m_kl].m_material.
            super___shared_ptr<chrono::fea::ChMaterialShellANCF,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_00 = pLVar57[this->m_kl].m_material.
            super___shared_ptr<chrono::fea::ChMaterialShellANCF,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  auVar130._8_56_ = auStack_a38;
  auVar130._0_8_ = local_a40.data;
  pCVar79 = &peVar58->m_E_eps;
  dVar154 = this->m_element->m_GaussScaling;
  local_bc0._64_8_ = local_bc0 + 0x80;
  lVar83 = 0x10;
  do {
    auVar42._8_8_ = 0;
    auVar42._0_8_ = *(ulong *)&pCVar79->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
    ;
    auVar124 = vbroadcastsd_avx512f(auVar42);
    auVar43._8_8_ = 0;
    auVar43._0_8_ =
         *(double *)
          ((long)&pCVar79->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_> + 0x30);
    auVar167 = vbroadcastsd_avx512f(auVar43);
    auVar44._8_8_ = 0;
    auVar44._0_8_ =
         *(double *)
          ((long)&pCVar79->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_> + 0x60);
    auVar128 = vbroadcastsd_avx512f(auVar44);
    auVar45._8_8_ = 0;
    auVar45._0_8_ =
         *(double *)
          ((long)&pCVar79->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_> + 0x90);
    auVar125 = vbroadcastsd_avx512f(auVar45);
    auVar46._8_8_ = 0;
    auVar46._0_8_ =
         *(double *)
          ((long)&pCVar79->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_> + 0xc0);
    auVar127 = vbroadcastsd_avx512f(auVar46);
    auVar47._8_8_ = 0;
    auVar47._0_8_ =
         *(double *)
          ((long)&pCVar79->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_> + 0xf0);
    auVar126 = vbroadcastsd_avx512f(auVar47);
    pCVar79 = (ChMatrixNM<double,_6,_6> *)
              ((long)&pCVar79->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_> + 8);
    auVar129 = vmulpd_avx512f(auVar130,auVar124);
    auVar131 = vmulpd_avx512f(local_a00,auVar124);
    auVar124 = vmulpd_avx512f(local_9c0,auVar124);
    auVar129 = vfmadd231pd_avx512f(auVar129,local_980,auVar167);
    auVar131 = vfmadd231pd_avx512f(auVar131,local_940,auVar167);
    auVar124 = vfmadd231pd_avx512f(auVar124,local_900,auVar167);
    auVar167 = vfmadd231pd_avx512f(auVar129,local_8c0,auVar128);
    auVar129 = vfmadd231pd_avx512f(auVar131,local_880,auVar128);
    auVar124 = vfmadd231pd_avx512f(auVar124,local_840,auVar128);
    auVar167 = vfmadd231pd_avx512f(auVar167,local_800,auVar125);
    auVar128 = vfmadd231pd_avx512f(auVar129,local_7c0,auVar125);
    auVar124 = vfmadd231pd_avx512f(auVar124,local_780,auVar125);
    auVar167 = vfmadd231pd_avx512f(auVar167,local_740,auVar127);
    auVar128 = vfmadd231pd_avx512f(auVar128,local_700,auVar127);
    auVar124 = vfmadd231pd_avx512f(auVar124,local_6c0,auVar127);
    auVar167 = vfmadd231pd_avx512f(auVar167,local_680,auVar126);
    auVar128 = vfmadd231pd_avx512f(auVar128,local_640,auVar126);
    auVar124 = vfmadd231pd_avx512f(auVar124,local_600,auVar126);
    *(undefined1 (*) [64])
     (local_12b0.super_PlainObjectBase<Eigen::Matrix<double,_6,_5,_1,_6,_5>_>.m_storage.m_data.array
     + lVar83 + 0xe) = auVar167;
    *(undefined1 (*) [64])(local_11c0 + lVar83 * 8 + -0x40) = auVar128;
    *(undefined1 (*) [64])(local_11c0 + lVar83 * 8) = auVar124;
    lVar83 = lVar83 + 0x18;
  } while (lVar83 != 0xa0);
  auVar48._8_8_ = 0;
  auVar48._0_8_ = local_18b0._0_8_;
  auVar124 = vbroadcastsd_avx512f(auVar48);
  auVar49._8_8_ = 0;
  auVar49._0_8_ = local_18b0._8_8_;
  auVar167 = vbroadcastsd_avx512f(auVar49);
  auVar50._8_8_ = 0;
  auVar50._0_8_ = local_18a0._0_8_;
  auVar128 = vbroadcastsd_avx512f(auVar50);
  auVar51._8_8_ = 0;
  auVar51._0_8_ = local_18a0._8_8_;
  auVar125 = vbroadcastsd_avx512f(auVar51);
  auVar52._8_8_ = 0;
  auVar52._0_8_ = local_1890._0_8_;
  auVar127 = vbroadcastsd_avx512f(auVar52);
  auVar53._8_8_ = 0;
  auVar53._0_8_ = local_1890._8_8_;
  auVar126 = vbroadcastsd_avx512f(auVar53);
  local_128.m_rhs.m_functor.m_other = dVar154 * local_1740;
  lVar83 = 0;
  auVar131._8_8_ = local_11c0._8_8_;
  auVar131._0_8_ = local_11c0._0_8_;
  auVar131._16_8_ = pdStack_11b0;
  auVar131._24_8_ = uStack_11a8;
  auVar131._32_8_ = dStack_11a0;
  auVar131._40_24_ = auStack_1198;
  auVar129 = vmulpd_avx512f(auVar124,auVar131);
  auVar132._16_8_ = dStack_1170;
  auVar132._0_16_ = local_1180;
  auVar132._24_40_ = auStack_1168;
  auVar130 = vmulpd_avx512f(auVar124,auVar132);
  auVar133._8_40_ = auStack_1138;
  auVar133._0_8_ = local_1140;
  auVar133._48_8_ = dStack_1110;
  auVar133._56_8_ = uStack_1108;
  auVar124 = vmulpd_avx512f(auVar124,auVar133);
  auVar129 = vfmadd231pd_avx512f(auVar129,auVar167,local_1100);
  auVar134._16_8_ = dStack_10b0;
  auVar134._0_16_ = local_10c0;
  auVar134._24_40_ = auStack_10a8;
  auVar130 = vfmadd231pd_avx512f(auVar130,auVar167,auVar134);
  auVar124 = vfmadd231pd_avx512f(auVar124,auVar167,local_1080);
  auVar167 = vfmadd231pd_avx512f(auVar129,auVar128,local_1040);
  auVar129 = vfmadd231pd_avx512f(auVar130,auVar128,local_1000);
  auVar124 = vfmadd231pd_avx512f(auVar124,auVar128,local_fc0);
  auVar167 = vfmadd231pd_avx512f(auVar167,auVar125,local_f80);
  auVar128 = vfmadd231pd_avx512f(auVar129,auVar125,local_f40);
  auVar124 = vfmadd231pd_avx512f(auVar124,auVar125,local_f00);
  auVar167 = vfmadd231pd_avx512f(auVar167,auVar127,local_ec0);
  auVar128 = vfmadd231pd_avx512f(auVar128,auVar127,local_e80);
  auVar124 = vfmadd231pd_avx512f(auVar124,auVar127,local_e40);
  local_bc0._128_64_ = vfmadd231pd_avx512f(auVar167,auVar126,local_e00);
  local_b00 = vfmadd231pd_avx512f(auVar128,auVar126,local_dc0);
  auVar124 = vfmadd231pd_avx512f(auVar124,auVar126,local_d80);
  local_a80 = local_128.m_rhs.m_functor.m_other;
  auVar54._8_8_ = 0;
  auVar54._0_8_ = local_128.m_rhs.m_functor.m_other;
  auVar167 = vbroadcastsd_avx512f(auVar54);
  _local_13c0 = vmulpd_avx512f(local_bc0._128_64_,auVar167);
  _local_1380 = vmulpd_avx512f(local_b00,auVar167);
  _local_1340 = vmulpd_avx512f(auVar124,auVar167);
  do {
    dVar154 = local_12b0.super_PlainObjectBase<Eigen::Matrix<double,_6,_5,_1,_6,_5>_>.m_storage.
              m_data.array[lVar83];
    dVar161 = local_12b0.super_PlainObjectBase<Eigen::Matrix<double,_6,_5,_1,_6,_5>_>.m_storage.
              m_data.array[lVar83 + 5];
    dVar160 = local_12b0.super_PlainObjectBase<Eigen::Matrix<double,_6,_5,_1,_6,_5>_>.m_storage.
              m_data.array[lVar83 + 10];
    dVar194 = local_12b0.super_PlainObjectBase<Eigen::Matrix<double,_6,_5,_1,_6,_5>_>.m_storage.
              m_data.array[lVar83 + 0xf];
    dVar7 = *(double *)(local_11c0 + lVar83 * 8 + -0x50);
    dVar8 = *(double *)(local_11c0 + lVar83 * 8 + -0x28);
    lVar86 = 0;
    do {
      rhs[lVar86].m_matrix =
           (non_const_type)
           (dVar154 * *(double *)((long)&peVar58->m_E_eps + lVar86 * 8) +
            dVar161 * *(double *)((long)&peVar58->m_E_eps + lVar86 * 8 + 0x30U) +
            dVar160 * *(double *)((long)&peVar58->m_E_eps + lVar86 * 8 + 0x60U) +
           dVar194 * *(double *)((long)&peVar58->m_E_eps + lVar86 * 8 + 0x90U) +
           dVar7 * *(double *)((long)&peVar58->m_E_eps + lVar86 * 8 + 0xc0U) +
           dVar8 * *(double *)((long)&peVar58->m_E_eps + lVar86 * 8 + 0xf0U));
      lVar86 = lVar86 + 1;
    } while (lVar86 != 6);
    lVar83 = lVar83 + 1;
    rhs = rhs + 6;
  } while (lVar83 != 5);
  pdVar78 = &dStack_11a0;
  local_bc0._8_8_ = local_bc0 + 0x10;
  lVar83 = 2;
  do {
    pdVar80 = pdVar78 + -2;
    pdVar1 = pdVar78 + -1;
    dVar154 = *pdVar78;
    pdVar2 = pdVar78 + 1;
    pdVar85 = pdVar78 + -4;
    pdVar4 = pdVar78 + -3;
    pdVar78 = pdVar78 + 6;
    dVar154 = (double)local_18b0._0_8_ * *pdVar85 +
              (double)local_18a0._0_8_ * *pdVar80 + (double)local_1890._0_8_ * dVar154;
    dVar161 = (double)local_18b0._8_8_ * *pdVar4 +
              (double)local_18a0._8_8_ * *pdVar1 + (double)local_1890._8_8_ * *pdVar2;
    auVar170._0_8_ = dVar154 + dVar161;
    auVar170._8_8_ = dVar154 + dVar161;
    uVar11 = vmovlpd_avx(auVar170);
    *(undefined8 *)(local_bc0 + lVar83 * 8) = uVar11;
    lVar83 = lVar83 + 1;
  } while (lVar83 != 7);
  local_128.m_lhs.m_lhs = (LhsNested)local_11c0;
  local_128.m_lhs.m_rhs = &local_12b0;
  local_1690 = local_128.m_rhs.m_functor.m_other * (double)local_bc0._16_8_;
  dStack_1688 = local_128.m_rhs.m_functor.m_other * (double)local_bc0._24_8_;
  local_1680 = local_128.m_rhs.m_functor.m_other * (double)local_bc0._32_8_;
  dStack_1678 = local_128.m_rhs.m_functor.m_other * (double)local_bc0._40_8_;
  local_1670 = local_128.m_rhs.m_functor.m_other * (double)local_bc0._48_8_;
  local_bc0._56_8_ = local_128.m_rhs.m_functor.m_other;
  Eigen::internal::
  call_dense_assignment_loop<Eigen::Matrix<double,5,5,1,5,5>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Product<Eigen::Matrix<double,5,6,1,5,6>,Eigen::Matrix<double,6,5,1,6,5>,0>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,5,5,0,5,5>const>const>,Eigen::internal::assign_op<double,double>>
            ((Matrix<double,_5,_5,_1,_5,_5> *)local_bc0,&local_128,&local_1911);
  uVar84 = -((ulong)__dest >> 3) & 6;
  if (uVar84 == 0) {
    (__dest->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
    [0x10] = (double)local_1340._0_8_;
    (__dest->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
    [0x11] = (double)local_1340._8_8_;
    (__dest->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
    [0x12] = dStack_1330;
    (__dest->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
    [0x13] = dStack_1328;
    (__dest->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
    [0x14] = dStack_1320;
    (__dest->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
    [0x15] = dStack_1318;
    (__dest->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
    [0x16] = dStack_1310;
    (__dest->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
    [0x17] = dStack_1308;
    (__dest->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
    [8] = (double)local_1380._0_8_;
    (__dest->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
    [9] = (double)local_1380._8_8_;
    (__dest->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
    [10] = dStack_1370;
    (__dest->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
    [0xb] = dStack_1368;
    (__dest->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
    [0xc] = dStack_1360;
    (__dest->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
    [0xd] = dStack_1358;
    (__dest->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
    [0xe] = dStack_1350;
    (__dest->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
    [0xf] = dStack_1348;
    (__dest->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
    [0] = (double)local_13c0._0_8_;
    (__dest->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
    [1] = (double)local_13c0._8_8_;
    (__dest->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
    [2] = dStack_13b0;
    (__dest->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
    [3] = dStack_13a8;
    (__dest->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
    [4] = dStack_13a0;
    (__dest->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
    [5] = dStack_1398;
    (__dest->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
    [6] = dStack_1390;
    (__dest->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.m_data.array
    [7] = dStack_1388;
  }
  else {
    uVar88 = (uint)uVar84;
    uVar87 = ((uint)-((ulong)__dest >> 3) & 6) << 3;
    uVar84 = (ulong)uVar87;
    memcpy(__dest,local_13c0,uVar84);
    memcpy((void *)((long)(__dest->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).
                          m_storage.m_data.array + uVar84),local_13c0 + uVar84,
           (ulong)(~uVar88 + (0x18 - uVar88 & 0xfffffff8 | uVar88) & 0xfffffff8) * 8 + 0x40);
    uVar88 = (0x18 - uVar88) * 8;
    uVar84 = (ulong)(uVar88 & 0xffffffc0 | uVar87);
    memcpy((void *)((long)(__dest->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).
                          m_storage.m_data.array + uVar84),local_13c0 + uVar84,
           (ulong)(uVar88 & 0x30));
  }
  pdVar78 = (__dest->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.
            m_data.array + 0x18;
  uVar87 = -((uint)((ulong)pdVar78 >> 3) & 0x1fffffff) & 6;
  uVar88 = 5;
  if (uVar87 < 5) {
    uVar88 = uVar87;
  }
  if ((uVar87 == 0) || (memcpy(pdVar78,&local_1690,(ulong)(uVar88 * 8)), uVar87 < 5)) {
    uVar84 = (ulong)(uVar88 << 3);
    memcpy((void *)((long)(__dest->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).
                          m_storage.m_data.array + uVar84 + 0xc0),
           (void *)((long)&local_1690 + uVar84),0x28 - uVar84);
  }
  pdVar78 = (__dest->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).m_storage.
            m_data.array + 0x1d;
  uVar87 = -((uint)((ulong)pdVar78 >> 3) & 0x1fffffff) & 7;
  uVar84 = (ulong)(uVar87 * 8);
  uVar88 = 0x19 - uVar87 & 0xfffffff8;
  memcpy(pdVar78,local_bc0,uVar84);
  memcpy((void *)((long)(__dest->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).
                        m_storage.m_data.array + uVar84 + 0xe8),local_bc0 + uVar84,
         (ulong)(uVar88 * 8 + 0xf8 & 0xc0) + 0x40);
  if ((uVar87 | uVar88) < 0x19) {
    uVar88 = (0x19 - uVar87) * 8;
    uVar84 = (ulong)(uVar88 & 0xffffffc0 | uVar87 * 8);
    memcpy((void *)((long)(__dest->super_PlainObjectBase<Eigen::Matrix<double,_54,_1,_0,_54,_1>_>).
                          m_storage.m_data.array + uVar84 + 0xe8),local_bc0 + uVar84,
           (ulong)(uVar88 & 0x38));
  }
  return;
}

Assistant:

void ShellANCF_Force::Evaluate(ChVectorN<double, 54>& result, const double x, const double y, const double z) {
    // Element shape function
    ChElementShellANCF_3423::ShapeVector N;
    m_element->ShapeFunctions(N, x, y, z);

    // Determinant of position vector gradient matrix: Initial configuration
    ChElementShellANCF_3423::ShapeVector Nx;
    ChElementShellANCF_3423::ShapeVector Ny;
    ChElementShellANCF_3423::ShapeVector Nz;
    ChMatrixNM<double, 1, 3> Nx_d0;
    ChMatrixNM<double, 1, 3> Ny_d0;
    ChMatrixNM<double, 1, 3> Nz_d0;
    double detJ0 = m_element->Calc_detJ0(x, y, z, Nx, Ny, Nz, Nx_d0, Ny_d0, Nz_d0);

    // ANS shape function
    ChMatrixNM<double, 1, 4> S_ANS;  // Shape function vector for Assumed Natural Strain
    ChMatrixNM<double, 6, 5> M;      // Shape function vector for Enhanced Assumed Strain
    m_element->ShapeFunctionANSbilinearShell(S_ANS, x, y);
    m_element->Basis_M(M, x, y, z);

    // Transformation : Orthogonal transformation (A and J)
    ChVector<double> G1xG2;  // Cross product of first and second column of
    double G1dotG1;          // Dot product of first column of position vector gradient

    G1xG2.x() = Nx_d0(1) * Ny_d0(2) - Nx_d0(2) * Ny_d0(1);
    G1xG2.y() = Nx_d0(2) * Ny_d0(0) - Nx_d0(0) * Ny_d0(2);
    G1xG2.z() = Nx_d0(0) * Ny_d0(1) - Nx_d0(1) * Ny_d0(0);
    G1dotG1 = Nx_d0(0) * Nx_d0(0) + Nx_d0(1) * Nx_d0(1) + Nx_d0(2) * Nx_d0(2);

    // Tangent Frame
    ChVector<double> A1;
    ChVector<double> A2;
    ChVector<double> A3;
    A1.x() = Nx_d0(0);
    A1.y() = Nx_d0(1);
    A1.z() = Nx_d0(2);
    A1 = A1 / sqrt(G1dotG1);
    A3 = G1xG2.GetNormalized();
    A2.Cross(A3, A1);

    // Direction for orthotropic material
    double theta = m_element->GetLayer(m_kl).Get_theta();  // Fiber angle
    ChVector<double> AA1;
    ChVector<double> AA2;
    ChVector<double> AA3;
    AA1 = A1 * cos(theta) + A2 * sin(theta);
    AA2 = -A1 * sin(theta) + A2 * cos(theta);
    AA3 = A3;

    /// Beta
    ChMatrixNM<double, 3, 3> j0;
    ChVector<double> j01;
    ChVector<double> j02;
    ChVector<double> j03;
    ChVectorN<double, 9> beta;
    // Calculates inverse of rd0 (j0) (position vector gradient: Initial Configuration)
    j0(0, 0) = Ny_d0(1) * Nz_d0(2) - Nz_d0(1) * Ny_d0(2);
    j0(0, 1) = Ny_d0(2) * Nz_d0(0) - Ny_d0(0) * Nz_d0(2);
    j0(0, 2) = Ny_d0(0) * Nz_d0(1) - Nz_d0(0) * Ny_d0(1);
    j0(1, 0) = Nz_d0(1) * Nx_d0(2) - Nx_d0(1) * Nz_d0(2);
    j0(1, 1) = Nz_d0(2) * Nx_d0(0) - Nx_d0(2) * Nz_d0(0);
    j0(1, 2) = Nz_d0(0) * Nx_d0(1) - Nz_d0(1) * Nx_d0(0);
    j0(2, 0) = Nx_d0(1) * Ny_d0(2) - Ny_d0(1) * Nx_d0(2);
    j0(2, 1) = Ny_d0(0) * Nx_d0(2) - Nx_d0(0) * Ny_d0(2);
    j0(2, 2) = Nx_d0(0) * Ny_d0(1) - Ny_d0(0) * Nx_d0(1);
    j0 /= detJ0;

    j01[0] = j0(0, 0);
    j02[0] = j0(1, 0);
    j03[0] = j0(2, 0);
    j01[1] = j0(0, 1);
    j02[1] = j0(1, 1);
    j03[1] = j0(2, 1);
    j01[2] = j0(0, 2);
    j02[2] = j0(1, 2);
    j03[2] = j0(2, 2);

    // Coefficients of contravariant transformation
    beta(0) = Vdot(AA1, j01);
    beta(1) = Vdot(AA2, j01);
    beta(2) = Vdot(AA3, j01);
    beta(3) = Vdot(AA1, j02);
    beta(4) = Vdot(AA2, j02);
    beta(5) = Vdot(AA3, j02);
    beta(6) = Vdot(AA1, j03);
    beta(7) = Vdot(AA2, j03);
    beta(8) = Vdot(AA3, j03);

    // Transformation matrix, function of fiber angle
    const ChMatrixNM<double, 6, 6>& T0 = m_element->GetLayer(m_kl).Get_T0();
    // Determinant of the initial position vector gradient at the element center
    double detJ0C = m_element->GetLayer(m_kl).Get_detJ0C();

    // Enhanced Assumed Strain
    ChMatrixNM<double, 6, 5> G = T0 * M * (detJ0C / detJ0);
    ChVectorN<double, 6> strain_EAS = G * (*m_alpha_eas);

    ChVectorN<double, 8> ddNx = m_element->m_ddT * Nx.transpose();
    ChVectorN<double, 8> ddNy = m_element->m_ddT * Ny.transpose();

    ChVectorN<double, 8> d0d0Nx = m_element->m_d0d0T * Nx.transpose();
    ChVectorN<double, 8> d0d0Ny = m_element->m_d0d0T * Ny.transpose();

    // Strain component
    ChVectorN<double, 6> strain_til;
    strain_til(0) = 0.5 * ((Nx * ddNx)(0, 0) - (Nx * d0d0Nx)(0, 0));
    strain_til(1) = 0.5 * ((Ny * ddNy)(0, 0) - (Ny * d0d0Ny)(0, 0));
    strain_til(2) = (Nx * ddNy)(0, 0) - (Nx * d0d0Ny)(0, 0);
    strain_til(3) = N(0) * m_element->m_strainANS(0) + N(2) * m_element->m_strainANS(1) +
                    N(4) * m_element->m_strainANS(2) + N(6) * m_element->m_strainANS(3);
    strain_til(4) = S_ANS(0, 2) * m_element->m_strainANS(6) + S_ANS(0, 3) * m_element->m_strainANS(7);
    strain_til(5) = S_ANS(0, 0) * m_element->m_strainANS(4) + S_ANS(0, 1) * m_element->m_strainANS(5);

    // For orthotropic material
    ChVectorN<double, 6> strain;

    strain(0) = strain_til(0) * beta(0) * beta(0) + strain_til(1) * beta(3) * beta(3) +
                strain_til(2) * beta(0) * beta(3) + strain_til(3) * beta(6) * beta(6) +
                strain_til(4) * beta(0) * beta(6) + strain_til(5) * beta(3) * beta(6);
    strain(1) = strain_til(0) * beta(1) * beta(1) + strain_til(1) * beta(4) * beta(4) +
                strain_til(2) * beta(1) * beta(4) + strain_til(3) * beta(7) * beta(7) +
                strain_til(4) * beta(1) * beta(7) + strain_til(5) * beta(4) * beta(7);
    strain(2) = strain_til(0) * 2.0 * beta(0) * beta(1) + strain_til(1) * 2.0 * beta(3) * beta(4) +
                strain_til(2) * (beta(1) * beta(3) + beta(0) * beta(4)) + strain_til(3) * 2.0 * beta(6) * beta(7) +
                strain_til(4) * (beta(1) * beta(6) + beta(0) * beta(7)) +
                strain_til(5) * (beta(4) * beta(6) + beta(3) * beta(7));
    strain(3) = strain_til(0) * beta(2) * beta(2) + strain_til(1) * beta(5) * beta(5) +
                strain_til(2) * beta(2) * beta(5) + strain_til(3) * beta(8) * beta(8) +
                strain_til(4) * beta(2) * beta(8) + strain_til(5) * beta(5) * beta(8);
    strain(4) = strain_til(0) * 2.0 * beta(0) * beta(2) + strain_til(1) * 2.0 * beta(3) * beta(5) +
                strain_til(2) * (beta(2) * beta(3) + beta(0) * beta(5)) + strain_til(3) * 2.0 * beta(6) * beta(8) +
                strain_til(4) * (beta(2) * beta(6) + beta(0) * beta(8)) +
                strain_til(5) * (beta(5) * beta(6) + beta(3) * beta(8));
    strain(5) = strain_til(0) * 2.0 * beta(1) * beta(2) + strain_til(1) * 2.0 * beta(4) * beta(5) +
                strain_til(2) * (beta(2) * beta(4) + beta(1) * beta(5)) + strain_til(3) * 2.0 * beta(7) * beta(8) +
                strain_til(4) * (beta(2) * beta(7) + beta(1) * beta(8)) +
                strain_til(5) * (beta(5) * beta(7) + beta(4) * beta(8));

    // Strain derivative component

    ChMatrixNM<double, 6, 24> strainD_til;

    ChMatrixNM<double, 1, 24> tempB;
    ChMatrixNM<double, 1, 3> tempB3;
    ChMatrixNM<double, 1, 3> tempB31;

    tempB3 = Nx * m_element->m_d;
    for (int i = 0; i < 8; i++) {
        for (int j = 0; j < 3; j++) {
            tempB(0, i * 3 + j) = tempB3(0, j) * Nx(0, i);
        }
    }
    strainD_til.row(0) = tempB;

    tempB3 = Ny * m_element->m_d;
    for (int i = 0; i < 8; i++) {
        for (int j = 0; j < 3; j++) {
            tempB(0, i * 3 + j) = tempB3(0, j) * Ny(0, i);
        }
    }
    strainD_til.row(1) = tempB;

    tempB31 = Nx * m_element->m_d;
    for (int i = 0; i < 8; i++) {
        for (int j = 0; j < 3; j++) {
            tempB(0, i * 3 + j) = tempB3(0, j) * Nx(0, i) + tempB31(0, j) * Ny(0, i);
        }
    }
    strainD_til.row(2) = tempB;

    tempB.setZero();
    for (int i = 0; i < 4; i++) {
        tempB += N(i * 2) * m_element->m_strainANS_D.row(i);
    }
    strainD_til.row(3) = tempB;  // strainD for zz

    tempB.setZero();
    for (int i = 0; i < 2; i++) {
        tempB += S_ANS(0, i + 2) * m_element->m_strainANS_D.row(i + 6);
    }
    strainD_til.row(4) = tempB;  // strainD for xz

    tempB.setZero();
    for (int i = 0; i < 2; i++) {
        tempB += S_ANS(0, i) * m_element->m_strainANS_D.row(i + 4);
    }
    strainD_til.row(5) = tempB;  // strainD for yz

    // For orthotropic material
    ChMatrixNM<double, 6, 24> strainD;  // Derivative of the strains w.r.t. the coordinates. Includes orthotropy
    for (int ii = 0; ii < 24; ii++) {
        strainD(0, ii) = strainD_til(0, ii) * beta(0) * beta(0) + strainD_til(1, ii) * beta(3) * beta(3) +
                         strainD_til(2, ii) * beta(0) * beta(3) + strainD_til(3, ii) * beta(6) * beta(6) +
                         strainD_til(4, ii) * beta(0) * beta(6) + strainD_til(5, ii) * beta(3) * beta(6);
        strainD(1, ii) = strainD_til(0, ii) * beta(1) * beta(1) + strainD_til(1, ii) * beta(4) * beta(4) +
                         strainD_til(2, ii) * beta(1) * beta(4) + strainD_til(3, ii) * beta(7) * beta(7) +
                         strainD_til(4, ii) * beta(1) * beta(7) + strainD_til(5, ii) * beta(4) * beta(7);
        strainD(2, ii) = strainD_til(0, ii) * 2.0 * beta(0) * beta(1) + strainD_til(1, ii) * 2.0 * beta(3) * beta(4) +
                         strainD_til(2, ii) * (beta(1) * beta(3) + beta(0) * beta(4)) +
                         strainD_til(3, ii) * 2.0 * beta(6) * beta(7) +
                         strainD_til(4, ii) * (beta(1) * beta(6) + beta(0) * beta(7)) +
                         strainD_til(5, ii) * (beta(4) * beta(6) + beta(3) * beta(7));
        strainD(3, ii) = strainD_til(0, ii) * beta(2) * beta(2) + strainD_til(1, ii) * beta(5) * beta(5) +
                         strainD_til(2, ii) * beta(2) * beta(5) + strainD_til(3, ii) * beta(8) * beta(8) +
                         strainD_til(4, ii) * beta(2) * beta(8) + strainD_til(5) * beta(5) * beta(8);
        strainD(4, ii) = strainD_til(0, ii) * 2.0 * beta(0) * beta(2) + strainD_til(1, ii) * 2.0 * beta(3) * beta(5) +
                         strainD_til(2, ii) * (beta(2) * beta(3) + beta(0) * beta(5)) +
                         strainD_til(3, ii) * 2.0 * beta(6) * beta(8) +
                         strainD_til(4, ii) * (beta(2) * beta(6) + beta(0) * beta(8)) +
                         strainD_til(5, ii) * (beta(5) * beta(6) + beta(3) * beta(8));
        strainD(5, ii) = strainD_til(0, ii) * 2.0 * beta(1) * beta(2) + strainD_til(1, ii) * 2.0 * beta(4) * beta(5) +
                         strainD_til(2, ii) * (beta(2) * beta(4) + beta(1) * beta(5)) +
                         strainD_til(3, ii) * 2.0 * beta(7) * beta(8) +
                         strainD_til(4, ii) * (beta(2) * beta(7) + beta(1) * beta(8)) +
                         strainD_til(5, ii) * (beta(5) * beta(7) + beta(4) * beta(8));
    }

    // Enhanced Assumed Strain 2nd
    strain += strain_EAS;

    // Strain time derivative for structural damping
    ChVectorN<double, 6> DEPS;
    DEPS.setZero();
    for (int ii = 0; ii < 24; ii++) {
        DEPS(0) += strainD(0, ii) * m_element->m_d_dt(ii);
        DEPS(1) += strainD(1, ii) * m_element->m_d_dt(ii);
        DEPS(2) += strainD(2, ii) * m_element->m_d_dt(ii);
        DEPS(3) += strainD(3, ii) * m_element->m_d_dt(ii);
        DEPS(4) += strainD(4, ii) * m_element->m_d_dt(ii);
        DEPS(5) += strainD(5, ii) * m_element->m_d_dt(ii);
    }

    // Add structural damping
    strain += DEPS * m_element->m_Alpha;

    // Matrix of elastic coefficients: the input assumes the material *could* be orthotropic
    const ChMatrixNM<double, 6, 6>& E_eps = m_element->GetLayer(m_kl).GetMaterial()->Get_E_eps();

    // Internal force calculation
    ChVectorN<double, 24> Fint = (strainD.transpose() * E_eps * strain) * (detJ0 * m_element->m_GaussScaling);

    // EAS terms
    ChMatrixNM<double, 5, 6> temp56 = G.transpose() * E_eps;
    ChVectorN<double, 5> HE = (temp56 * strain) * (detJ0 * m_element->m_GaussScaling);     // EAS residual
    ChMatrixNM<double, 5, 5> KALPHA = (temp56 * G) * (detJ0 * m_element->m_GaussScaling);  // EAS Jacobian

    /// Total result vector
    result.segment(0, 24) = Fint;
    result.segment(24, 5) = HE;
    result.segment(29, 5 * 5) = Eigen::Map<ChVectorN<double, 5 * 5>>(KALPHA.data(), 5 * 5);
}